

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_fma::forward
          (InnerProduct_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  _func_int *p_Var19;
  int *piVar20;
  long lVar21;
  void *pvVar22;
  float *pfVar23;
  uint uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  int p;
  int iVar31;
  undefined1 (*pauVar32) [32];
  uint uVar33;
  ulong uVar34;
  undefined1 (*pauVar35) [32];
  uint uVar36;
  void *pvVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  undefined1 (*pauVar43) [32];
  long lVar44;
  long lVar45;
  long lVar46;
  uint uVar47;
  uint uVar48;
  long lVar49;
  long lVar50;
  uint uVar51;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar71;
  undefined1 auVar65 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [28];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar109;
  undefined1 auVar107 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar145 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar124 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [64];
  float fVar167;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar202 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [64];
  v4sf one;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar251 [32];
  undefined1 auVar245 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [64];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [32];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [64];
  float fVar310;
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  float fVar330;
  float fVar332;
  float fVar333;
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  float fVar331;
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [64];
  undefined1 auVar346 [16];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar351 [64];
  undefined1 auVar352 [16];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar358 [16];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [64];
  Option opt_flatten;
  int local_164;
  uint local_148;
  undefined1 (*local_138) [32];
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  int local_120;
  Allocator *local_118;
  int local_110;
  int iStack_10c;
  undefined8 uStack_108;
  undefined4 uStack_100;
  size_t local_f8;
  undefined1 local_e8 [16];
  InnerProduct_x86_fma *local_d0;
  ulong local_c8;
  Mat *local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar378 [12];
  undefined1 auVar68 [32];
  float fVar72;
  undefined1 auVar94 [32];
  float fVar108;
  undefined1 auVar144 [32];
  undefined1 auVar146 [32];
  
  auVar111 = in_ZMM12._0_16_;
  if ((opt->use_int8_inference == true) &&
     (*(int *)(&this->field_0xdc + (long)this->_vptr_InnerProduct_x86_fma[-3]) != 0)) {
    iVar31 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar31;
  }
  iVar31 = cpu_support_x86_f16c();
  if ((iVar31 != 0) && (opt->use_fp16_storage == true)) {
    iVar31 = forward_fp16s(this,bottom_blob,top_blob,opt);
    return iVar31;
  }
  local_110 = bottom_blob->dims;
  if ((local_110 == 2) &&
     (bottom_blob->w ==
      *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_fma[-3]) /
      *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]))) {
    Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]),
                bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
    local_164 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      p_Var19 = this->_vptr_InnerProduct_x86_fma[-3];
      innerproduct_gemm_sse
                (bottom_blob,top_blob,&this->weight_data_tm,
                 (Mat *)(&this->field_0x178 + (long)p_Var19),
                 *(int *)(&this->field_0xe0 + (long)p_Var19),
                 (Mat *)(&this->field_0xe8 + (long)p_Var19),opt);
      local_164 = 0;
    }
  }
  else {
    piVar20 = bottom_blob->refcount;
    local_138 = (undefined1 (*) [32])bottom_blob->data;
    uStack_130 = SUB84(bottom_blob->refcount,0);
    uStack_12c = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
    local_128 = (undefined4)bottom_blob->elemsize;
    uStack_124 = (undefined4)(bottom_blob->elemsize >> 0x20);
    local_120 = bottom_blob->elempack;
    local_118 = bottom_blob->allocator;
    uVar9 = bottom_blob->w;
    uVar10 = bottom_blob->h;
    uVar11 = bottom_blob->d;
    uVar12 = bottom_blob->c;
    auVar378._8_4_ = uVar12;
    auVar378._4_4_ = uVar11;
    auVar378._0_4_ = uVar10;
    uStack_108 = auVar378._0_8_;
    local_f8 = bottom_blob->cstep;
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + 1;
      UNLOCK();
    }
    iStack_10c = uVar9;
    uStack_100 = uVar12;
    if (bottom_blob->dims != 1) {
      auVar250[0] = opt->lightmode;
      auVar250._1_3_ = *(undefined3 *)&opt->field_0x1;
      auVar250._4_4_ = opt->num_threads;
      auVar250._8_8_ = opt->blob_allocator;
      uVar13 = opt->workspace_allocator;
      uVar14 = opt->openmp_blocktime;
      uVar15 = opt->use_winograd_convolution;
      uVar16 = opt->use_sgemm_convolution;
      uVar17 = opt->use_int8_inference;
      uVar18 = opt->use_vulkan_compute;
      auVar250[0x1f] = uVar18;
      auVar250[0x1e] = uVar17;
      auVar250[0x1d] = uVar16;
      auVar250[0x1c] = uVar15;
      auVar250._24_4_ = uVar14;
      auVar250._16_8_ = uVar13;
      local_58._0_1_ = opt->use_bf16_storage;
      local_58._1_1_ = opt->use_fp16_packed;
      local_58._2_1_ = opt->use_fp16_storage;
      local_58._3_1_ = opt->use_fp16_arithmetic;
      local_58._4_1_ = opt->use_int8_packed;
      local_58._5_1_ = opt->use_int8_storage;
      local_58._6_1_ = opt->use_int8_arithmetic;
      local_58._7_1_ = opt->use_packing_layout;
      uStack_50._0_1_ = opt->use_shader_pack8;
      uStack_50._1_1_ = opt->use_subgroup_basic;
      uStack_50._2_1_ = opt->use_subgroup_vote;
      uStack_50._3_1_ = opt->use_subgroup_ballot;
      uStack_50._4_1_ = opt->use_subgroup_shuffle;
      uStack_50._5_1_ = opt->use_image_storage;
      uStack_50._6_1_ = opt->use_tensor_storage;
      uStack_50._7_1_ = opt->use_reserved_0;
      uStack_48._0_4_ = opt->flush_denormals;
      uStack_48._4_1_ = opt->use_local_pool_allocator;
      uStack_48._5_1_ = opt->use_shader_local_memory;
      uStack_48._6_1_ = opt->use_cooperative_matrix;
      uStack_48._7_1_ = opt->use_winograd23_convolution;
      uStack_40._0_1_ = opt->use_winograd43_convolution;
      uStack_40._1_1_ = opt->use_winograd63_convolution;
      uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
      uStack_40._3_1_ = opt->use_reserved_7;
      uStack_40._4_1_ = opt->use_reserved_8;
      uStack_40._5_1_ = opt->use_reserved_9;
      uStack_40._6_1_ = opt->use_reserved_10;
      uStack_40._7_1_ = opt->use_reserved_11;
      local_78 = auVar250._0_8_;
      pAStack_70 = opt->workspace_allocator;
      auStack_68 = auVar250._16_16_;
      (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_138);
    }
    uVar33 = 1;
    if (opt->use_packing_layout == true) {
      uVar33 = 8;
      if ((*(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]) & 7) != 0) {
        uVar33 = (uint)((*(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]) &
                        3) == 0) * 3 + 1;
      }
    }
    Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]) /
                         (int)uVar33,
                (ulong)uVar33 * (CONCAT44(uStack_124,local_128) / (ulong)(long)local_120),uVar33,
                opt->blob_allocator);
    pauVar43 = local_138;
    local_164 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      p_Var19 = this->_vptr_InnerProduct_x86_fma[-3];
      uVar33 = *(uint *)(&this->field_0xe0 + (long)p_Var19);
      uVar51 = local_120 * iStack_10c;
      iVar31 = top_blob->elempack;
      uVar36 = top_blob->w;
      lVar21 = *(long *)(&this->field_0x178 + (long)p_Var19);
      local_164 = 0;
      if (iVar31 == 1) {
        local_c8 = (ulong)(int)uVar36;
        lVar45 = (long)(int)uVar51;
        if (0 < (int)uVar36 >> 3) {
          local_90 = (ulong)(uint)((int)uVar36 >> 3);
          lVar40 = lVar45 * 0x1c;
          local_98 = lVar45 * 0x20;
          lVar39 = lVar45 * 8;
          lVar44 = lVar45 * 0x18;
          local_a8 = lVar45 * 4;
          lVar46 = lVar45 * 0x14;
          lVar49 = lVar45 << 4;
          local_b0 = lVar45 * 0xc;
          local_b8 = 0;
          auVar256 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          auVar107 = ZEXT1664(ZEXT816(0) << 0x40);
          uVar34 = 0;
          do {
            local_80 = uVar34 * 8;
            auVar166 = ZEXT1664(ZEXT816(0) << 0x40);
            if (lVar21 != 0) {
              auVar166 = ZEXT3264(*(undefined1 (*) [32])(lVar21 + uVar34 * 0x20));
            }
            auVar250 = auVar166._0_32_;
            pvVar37 = (this->weight_data_tm).data;
            local_e8._0_8_ = lVar46;
            if ((int)uVar51 < 8) {
              uVar48 = 0;
              lVar50 = local_80 * lVar45 * 4;
              lVar1 = (local_80 | 1) * lVar45 * 4;
              lVar2 = (local_80 | 2) * lVar45 * 4;
              lVar3 = (local_80 | 3) * lVar45 * 4;
              lVar4 = (local_80 | 4) * lVar45 * 4;
              lVar5 = (local_80 | 5) * lVar45 * 4;
              lVar6 = (local_80 | 6) * lVar45 * 4;
              lVar7 = (local_80 | 7) * lVar45 * 4;
              auVar367 = SUB6432(ZEXT864(0),0);
              auVar59 = ZEXT816(0);
              auVar99 = SUB6432(ZEXT864(0),0);
              auVar172 = ZEXT816(0);
              auVar67 = SUB6432(ZEXT864(0),0);
              auVar97 = SUB6432(ZEXT864(0),0);
              auVar165 = SUB6432(ZEXT864(0),0);
              auVar168 = ZEXT816(0);
              pauVar32 = local_138;
              local_a0 = lVar40;
            }
            else {
              auVar168 = ZEXT816(0);
              iVar31 = 7;
              auVar309 = ZEXT864(0);
              auVar244 = ZEXT864(0);
              auVar377 = ZEXT864(0);
              auVar172 = ZEXT816(0);
              auVar201 = ZEXT864(0);
              auVar59 = ZEXT816(0);
              auVar345 = ZEXT864(0);
              lVar50 = 0;
              do {
                lVar38 = lVar50;
                auVar367 = *(undefined1 (*) [32])(*local_138 + lVar38);
                auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar367,
                                           *(undefined1 (*) [32])((long)pvVar37 + lVar38 + local_b8)
                                          );
                auVar111 = vfmadd231ps_fma(auVar309._0_32_,auVar367,
                                           *(undefined1 (*) [32])((long)pvVar37 + lVar38 + local_a8)
                                          );
                auVar309 = ZEXT1664(auVar111);
                auVar165 = ZEXT1632(auVar111);
                auVar111 = vfmadd231ps_fma(auVar244._0_32_,auVar367,
                                           *(undefined1 (*) [32])((long)pvVar37 + lVar38 + lVar39));
                auVar244 = ZEXT1664(auVar111);
                auVar97 = ZEXT1632(auVar111);
                auVar111 = vfmadd231ps_fma(auVar377._0_32_,auVar367,
                                           *(undefined1 (*) [32])((long)pvVar37 + lVar38 + local_b0)
                                          );
                auVar377 = ZEXT1664(auVar111);
                auVar67 = ZEXT1632(auVar111);
                auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),auVar367,
                                           *(undefined1 (*) [32])((long)pvVar37 + lVar38 + lVar49));
                auVar111 = vfmadd231ps_fma(auVar201._0_32_,auVar367,
                                           *(undefined1 (*) [32])((long)pvVar37 + lVar38 + lVar46));
                auVar201 = ZEXT1664(auVar111);
                auVar99 = ZEXT1632(auVar111);
                auVar59 = vfmadd231ps_fma(ZEXT1632(auVar59),auVar367,
                                          *(undefined1 (*) [32])((long)pvVar37 + lVar38 + lVar44));
                auVar111 = vfmadd231ps_fma(auVar345._0_32_,auVar367,
                                           *(undefined1 (*) [32])((long)pvVar37 + lVar38 + lVar40));
                auVar345 = ZEXT1664(auVar111);
                auVar367 = ZEXT1632(auVar111);
                iVar31 = iVar31 + 8;
                lVar50 = lVar38 + 0x20;
              } while (iVar31 < (int)uVar51);
              lVar7 = lVar50 + lVar40;
              lVar6 = lVar50 + lVar44;
              lVar5 = lVar50 + lVar46;
              lVar4 = lVar50 + lVar49;
              lVar3 = lVar50 + local_b0;
              lVar2 = lVar50 + lVar39;
              lVar1 = lVar50 + local_a8;
              lVar50 = lVar50 + local_b8;
              pauVar32 = (undefined1 (*) [32])(local_138[1] + lVar38);
              uVar48 = uVar51 & 0xfffffff8;
            }
            auVar111 = auVar165._0_16_;
            if (uVar51 - uVar48 != 0 && (int)uVar48 <= (int)uVar51) {
              lVar38 = 0;
              do {
                auVar360 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar37 + lVar38 * 4 + lVar4)),
                                         ZEXT416(*(uint *)((long)pvVar37 + lVar38 * 4 + lVar5)),0x10
                                        );
                auVar360 = vinsertps_avx(auVar360,ZEXT416(*(uint *)((long)pvVar37 +
                                                                   lVar38 * 4 + lVar6)),0x20);
                auVar360 = vinsertps_avx(auVar360,ZEXT416(*(uint *)((long)pvVar37 +
                                                                   lVar38 * 4 + lVar7)),0x30);
                auVar80 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar37 + lVar38 * 4 + lVar50)),
                                        ZEXT416(*(uint *)((long)pvVar37 + lVar38 * 4 + lVar1)),0x10)
                ;
                auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)((long)pvVar37 + lVar38 * 4 + lVar2
                                                                 )),0x20);
                auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)((long)pvVar37 + lVar38 * 4 + lVar3
                                                                 )),0x30);
                uVar8 = *(undefined4 *)(*pauVar32 + lVar38 * 4);
                auVar252._4_4_ = uVar8;
                auVar252._0_4_ = uVar8;
                auVar252._8_4_ = uVar8;
                auVar252._12_4_ = uVar8;
                auVar252._16_4_ = uVar8;
                auVar252._20_4_ = uVar8;
                auVar252._24_4_ = uVar8;
                auVar252._28_4_ = uVar8;
                auVar299._16_16_ = auVar360;
                auVar299._0_16_ = auVar80;
                auVar360 = vfmadd231ps_fma(auVar166._0_32_,auVar299,auVar252);
                auVar166 = ZEXT1664(auVar360);
                auVar250 = ZEXT1632(auVar360);
                lVar38 = lVar38 + 1;
              } while (uVar51 - uVar48 != (int)lVar38);
            }
            auVar165 = vhaddps_avx(ZEXT1632(auVar168),auVar165);
            auVar67 = vhaddps_avx(auVar97,auVar67);
            auVar67 = vhaddps_avx(auVar165,auVar67);
            auVar99 = vhaddps_avx(ZEXT1632(auVar172),auVar99);
            auVar97 = vhaddps_avx(ZEXT1632(auVar59),auVar367);
            auVar97 = vhaddps_avx(auVar99,auVar97);
            auVar99 = vblendps_avx(auVar67,auVar97,0xf0);
            auVar97 = vperm2f128_avx(auVar67,auVar97,0x21);
            fVar109 = auVar97._0_4_ + auVar99._0_4_ + auVar250._0_4_;
            fVar71 = auVar97._4_4_ + auVar99._4_4_ + auVar250._4_4_;
            auVar67._0_8_ = CONCAT44(fVar71,fVar109);
            auVar67._8_4_ = auVar97._8_4_ + auVar99._8_4_ + auVar250._8_4_;
            auVar67._12_4_ = auVar97._12_4_ + auVar99._12_4_ + auVar250._12_4_;
            auVar67._16_4_ = auVar97._16_4_ + auVar99._16_4_ + auVar250._16_4_;
            auVar67._20_4_ = auVar97._20_4_ + auVar99._20_4_ + auVar250._20_4_;
            auVar67._24_4_ = auVar97._24_4_ + auVar99._24_4_ + auVar250._24_4_;
            auVar67._28_4_ = auVar97._28_4_ + auVar99._28_4_ + auVar250._28_4_;
            auVar99 = auVar107._0_32_;
            auVar250 = auVar256._0_32_;
            fVar310 = auVar256._0_4_;
            fVar167 = auVar256._4_4_;
            fVar330 = auVar256._8_4_;
            fVar331 = auVar256._12_4_;
            fVar332 = auVar256._16_4_;
            fVar333 = auVar256._20_4_;
            fVar72 = auVar256._24_4_;
            fVar108 = auVar256._28_4_;
            switch(uVar33) {
            case 1:
              auVar67 = vmaxps_avx(auVar99,auVar67);
              break;
            case 2:
              auVar250 = vmaxps_avx(auVar99,auVar67);
              auVar99 = vminps_avx(auVar99,auVar67);
              uVar8 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
              auVar70._4_4_ = uVar8;
              auVar70._0_4_ = uVar8;
              auVar70._8_4_ = uVar8;
              auVar70._12_4_ = uVar8;
              auVar70._16_4_ = uVar8;
              auVar70._20_4_ = uVar8;
              auVar70._24_4_ = uVar8;
              auVar70._28_4_ = uVar8;
              auVar168 = vfmadd213ps_fma(auVar70,auVar99,auVar250);
              auVar67 = ZEXT1632(auVar168);
              break;
            case 3:
              uVar8 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
              auVar102._4_4_ = uVar8;
              auVar102._0_4_ = uVar8;
              auVar102._8_4_ = uVar8;
              auVar102._12_4_ = uVar8;
              auVar102._16_4_ = uVar8;
              auVar102._20_4_ = uVar8;
              auVar102._24_4_ = uVar8;
              auVar102._28_4_ = uVar8;
              uVar8 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var19))[1];
              auVar162._4_4_ = uVar8;
              auVar162._0_4_ = uVar8;
              auVar162._8_4_ = uVar8;
              auVar162._12_4_ = uVar8;
              auVar162._16_4_ = uVar8;
              auVar162._20_4_ = uVar8;
              auVar162._24_4_ = uVar8;
              auVar162._28_4_ = uVar8;
              auVar250 = vmaxps_avx(auVar67,auVar102);
              auVar67 = vminps_avx(auVar250,auVar162);
              break;
            case 4:
              auVar66._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
              auVar66._8_4_ = -auVar67._8_4_;
              auVar66._12_4_ = -auVar67._12_4_;
              auVar66._16_4_ = -auVar67._16_4_;
              auVar66._20_4_ = -auVar67._20_4_;
              auVar66._24_4_ = -auVar67._24_4_;
              auVar66._28_4_ = -auVar67._28_4_;
              auVar103._8_4_ = 0x42b0c0a5;
              auVar103._0_8_ = 0x42b0c0a542b0c0a5;
              auVar103._12_4_ = 0x42b0c0a5;
              auVar103._16_4_ = 0x42b0c0a5;
              auVar103._20_4_ = 0x42b0c0a5;
              auVar103._24_4_ = 0x42b0c0a5;
              auVar103._28_4_ = 0x42b0c0a5;
              auVar99 = vminps_avx(auVar66,auVar103);
              auVar104._8_4_ = 0xc2b0c0a5;
              auVar104._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar104._12_4_ = 0xc2b0c0a5;
              auVar104._16_4_ = 0xc2b0c0a5;
              auVar104._20_4_ = 0xc2b0c0a5;
              auVar104._24_4_ = 0xc2b0c0a5;
              auVar104._28_4_ = 0xc2b0c0a5;
              auVar67 = vmaxps_avx(auVar99,auVar104);
              auVar105._8_4_ = 0x3fb8aa3b;
              auVar105._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar105._12_4_ = 0x3fb8aa3b;
              auVar105._16_4_ = 0x3fb8aa3b;
              auVar105._20_4_ = 0x3fb8aa3b;
              auVar105._24_4_ = 0x3fb8aa3b;
              auVar105._28_4_ = 0x3fb8aa3b;
              auVar283._8_4_ = 0x3f000000;
              auVar283._0_8_ = 0x3f0000003f000000;
              auVar283._12_4_ = 0x3f000000;
              auVar283._16_4_ = 0x3f000000;
              auVar283._20_4_ = 0x3f000000;
              auVar283._24_4_ = 0x3f000000;
              auVar283._28_4_ = 0x3f000000;
              auVar168 = vfmadd213ps_fma(auVar105,auVar67,auVar283);
              auVar97 = vroundps_avx(ZEXT1632(auVar168),1);
              auVar99 = vcmpps_avx(ZEXT1632(auVar168),auVar97,1);
              auVar99 = vandps_avx(auVar99,auVar250);
              auVar99 = vsubps_avx(auVar97,auVar99);
              auVar163._8_4_ = 0x3f318000;
              auVar163._0_8_ = 0x3f3180003f318000;
              auVar163._12_4_ = 0x3f318000;
              auVar163._16_4_ = 0x3f318000;
              auVar163._20_4_ = 0x3f318000;
              auVar163._24_4_ = 0x3f318000;
              auVar163._28_4_ = 0x3f318000;
              auVar168 = vfmsub231ps_fma(auVar67,auVar99,auVar163);
              auVar164._8_4_ = 0x395e8083;
              auVar164._0_8_ = 0x395e8083395e8083;
              auVar164._12_4_ = 0x395e8083;
              auVar164._16_4_ = 0x395e8083;
              auVar164._20_4_ = 0x395e8083;
              auVar164._24_4_ = 0x395e8083;
              auVar164._28_4_ = 0x395e8083;
              auVar172 = vfmsub231ps_fma(ZEXT1632(auVar168),auVar99,auVar164);
              auVar67 = ZEXT1632(auVar172);
              auVar29._28_4_ = 0x395e8083;
              auVar29._0_28_ =
                   ZEXT1628(CONCAT412(auVar172._12_4_ * auVar172._12_4_,
                                      CONCAT48(auVar172._8_4_ * auVar172._8_4_,
                                               CONCAT44(auVar172._4_4_ * auVar172._4_4_,
                                                        auVar172._0_4_ * auVar172._0_4_))));
              auVar232._8_4_ = 0x39506967;
              auVar232._0_8_ = 0x3950696739506967;
              auVar232._12_4_ = 0x39506967;
              auVar232._16_4_ = 0x39506967;
              auVar232._20_4_ = 0x39506967;
              auVar232._24_4_ = 0x39506967;
              auVar232._28_4_ = 0x39506967;
              auVar254._8_4_ = 0x3ab743ce;
              auVar254._0_8_ = 0x3ab743ce3ab743ce;
              auVar254._12_4_ = 0x3ab743ce;
              auVar254._16_4_ = 0x3ab743ce;
              auVar254._20_4_ = 0x3ab743ce;
              auVar254._24_4_ = 0x3ab743ce;
              auVar254._28_4_ = 0x3ab743ce;
              auVar168 = vfmadd213ps_fma(auVar232,auVar67,auVar254);
              auVar255._8_4_ = 0x3c088908;
              auVar255._0_8_ = 0x3c0889083c088908;
              auVar255._12_4_ = 0x3c088908;
              auVar255._16_4_ = 0x3c088908;
              auVar255._20_4_ = 0x3c088908;
              auVar255._24_4_ = 0x3c088908;
              auVar255._28_4_ = 0x3c088908;
              auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar67,auVar255);
              auVar199._8_4_ = 0x3d2aa9c1;
              auVar199._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar199._12_4_ = 0x3d2aa9c1;
              auVar199._16_4_ = 0x3d2aa9c1;
              auVar199._20_4_ = 0x3d2aa9c1;
              auVar199._24_4_ = 0x3d2aa9c1;
              auVar199._28_4_ = 0x3d2aa9c1;
              auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar67,auVar199);
              auVar200._8_4_ = 0x3e2aaaaa;
              auVar200._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar200._12_4_ = 0x3e2aaaaa;
              auVar200._16_4_ = 0x3e2aaaaa;
              auVar200._20_4_ = 0x3e2aaaaa;
              auVar200._24_4_ = 0x3e2aaaaa;
              auVar200._28_4_ = 0x3e2aaaaa;
              auVar67 = ZEXT1632(auVar172);
              auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar67,auVar200);
              auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar67,auVar283);
              auVar59 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar29,auVar67);
              auVar58._0_4_ = (int)auVar99._0_4_;
              auVar58._4_4_ = (int)auVar99._4_4_;
              auVar58._8_4_ = (int)auVar99._8_4_;
              auVar58._12_4_ = (int)auVar99._12_4_;
              auVar68._16_4_ = (int)auVar99._16_4_;
              auVar68._0_16_ = auVar58;
              auVar68._20_4_ = (int)auVar99._20_4_;
              auVar68._24_4_ = (int)auVar99._24_4_;
              auVar68._28_4_ = (int)auVar99._28_4_;
              auVar172 = vpslld_avx(auVar58,0x17);
              auVar168 = vpslld_avx(auVar68._16_16_,0x17);
              auVar124._8_4_ = 0x3f800000;
              auVar124._0_8_ = 0x3f8000003f800000;
              auVar124._12_4_ = 0x3f800000;
              auVar168 = vpaddd_avx(auVar168,auVar124);
              auVar172 = vpaddd_avx(auVar172,auVar124);
              auVar69._16_16_ = auVar168;
              auVar69._0_16_ = auVar172;
              auVar106._0_4_ = auVar59._0_4_ + fVar310;
              auVar106._4_4_ = auVar59._4_4_ + fVar167;
              auVar106._8_4_ = auVar59._8_4_ + fVar330;
              auVar106._12_4_ = auVar59._12_4_ + fVar331;
              auVar106._16_4_ = fVar332 + 0.0;
              auVar106._20_4_ = fVar333 + 0.0;
              auVar106._24_4_ = fVar72 + 0.0;
              auVar106._28_4_ = fVar108 + 0.0;
              auVar168 = vfmadd213ps_fma(auVar69,auVar106,auVar250);
              auVar99 = vrcpps_avx(ZEXT1632(auVar168));
              auVar168 = vfmsub213ps_fma(ZEXT1632(auVar168),auVar99,auVar250);
              auVar168 = vfnmadd132ps_fma(ZEXT1632(auVar168),auVar99,auVar99);
              auVar67 = ZEXT1632(auVar168);
              break;
            case 5:
              auVar328._8_4_ = 0x42b0c0a5;
              auVar328._0_8_ = 0x42b0c0a542b0c0a5;
              auVar328._12_4_ = 0x42b0c0a5;
              auVar328._16_4_ = 0x42b0c0a5;
              auVar328._20_4_ = 0x42b0c0a5;
              auVar328._24_4_ = 0x42b0c0a5;
              auVar328._28_4_ = 0x42b0c0a5;
              auVar99 = vminps_avx(auVar328,auVar67);
              auVar342._8_4_ = 0xc2b0c0a5;
              auVar342._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar342._12_4_ = 0xc2b0c0a5;
              auVar342._16_4_ = 0xc2b0c0a5;
              auVar342._20_4_ = 0xc2b0c0a5;
              auVar342._24_4_ = 0xc2b0c0a5;
              auVar342._28_4_ = 0xc2b0c0a5;
              auVar97 = vmaxps_avx(auVar342,auVar99);
              auVar154._8_4_ = 0x3fb8aa3b;
              auVar154._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar154._12_4_ = 0x3fb8aa3b;
              auVar154._16_4_ = 0x3fb8aa3b;
              auVar154._20_4_ = 0x3fb8aa3b;
              auVar154._24_4_ = 0x3fb8aa3b;
              auVar154._28_4_ = 0x3fb8aa3b;
              auVar197._8_4_ = 0x3f000000;
              auVar197._0_8_ = 0x3f0000003f000000;
              auVar197._12_4_ = 0x3f000000;
              auVar197._16_4_ = 0x3f000000;
              auVar197._20_4_ = 0x3f000000;
              auVar197._24_4_ = 0x3f000000;
              auVar197._28_4_ = 0x3f000000;
              auVar111 = vfmadd213ps_fma(auVar154,auVar97,auVar197);
              auVar165 = vroundps_avx(ZEXT1632(auVar111),1);
              auVar99 = vcmpps_avx(ZEXT1632(auVar111),auVar165,1);
              auVar99 = vandps_avx(auVar99,auVar250);
              auVar99 = vsubps_avx(auVar165,auVar99);
              auVar357._8_4_ = 0x3f318000;
              auVar357._0_8_ = 0x3f3180003f318000;
              auVar357._12_4_ = 0x3f318000;
              auVar357._16_4_ = 0x3f318000;
              auVar357._20_4_ = 0x3f318000;
              auVar357._24_4_ = 0x3f318000;
              auVar357._28_4_ = 0x3f318000;
              auVar111 = vfmsub231ps_fma(auVar97,auVar99,auVar357);
              auVar343._8_4_ = 0xb95e8083;
              auVar343._0_8_ = 0xb95e8083b95e8083;
              auVar343._12_4_ = 0xb95e8083;
              auVar343._16_4_ = 0xb95e8083;
              auVar343._20_4_ = 0xb95e8083;
              auVar343._24_4_ = 0xb95e8083;
              auVar343._28_4_ = 0xb95e8083;
              auVar172 = vfnmsub231ps_fma(ZEXT1632(auVar111),auVar99,auVar343);
              auVar97 = ZEXT1632(auVar172);
              auVar367._28_4_ = auVar165._28_4_;
              auVar367._0_28_ =
                   ZEXT1628(CONCAT412(auVar172._12_4_ * auVar172._12_4_,
                                      CONCAT48(auVar172._8_4_ * auVar172._8_4_,
                                               CONCAT44(auVar172._4_4_ * auVar172._4_4_,
                                                        auVar172._0_4_ * auVar172._0_4_))));
              auVar376._8_4_ = 0x39506967;
              auVar376._0_8_ = 0x3950696739506967;
              auVar376._12_4_ = 0x39506967;
              auVar376._16_4_ = 0x39506967;
              auVar376._20_4_ = 0x39506967;
              auVar376._24_4_ = 0x39506967;
              auVar376._28_4_ = 0x39506967;
              auVar368._8_4_ = 0x3ab743ce;
              auVar368._0_8_ = 0x3ab743ce3ab743ce;
              auVar368._12_4_ = 0x3ab743ce;
              auVar368._16_4_ = 0x3ab743ce;
              auVar368._20_4_ = 0x3ab743ce;
              auVar368._24_4_ = 0x3ab743ce;
              auVar368._28_4_ = 0x3ab743ce;
              auVar111 = vfmadd213ps_fma(auVar376,auVar97,auVar368);
              auVar267._8_4_ = 0x3c088908;
              auVar267._0_8_ = 0x3c0889083c088908;
              auVar267._12_4_ = 0x3c088908;
              auVar267._16_4_ = 0x3c088908;
              auVar267._20_4_ = 0x3c088908;
              auVar267._24_4_ = 0x3c088908;
              auVar267._28_4_ = 0x3c088908;
              auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar97,auVar267);
              auVar198._8_4_ = 0x3d2aa9c1;
              auVar198._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar198._12_4_ = 0x3d2aa9c1;
              auVar198._16_4_ = 0x3d2aa9c1;
              auVar198._20_4_ = 0x3d2aa9c1;
              auVar198._24_4_ = 0x3d2aa9c1;
              auVar198._28_4_ = 0x3d2aa9c1;
              auVar168 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar97,auVar198);
              auVar111._8_4_ = 0x3e2aaaaa;
              auVar111._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar111._12_4_ = 0x3e2aaaaa;
              auVar350._16_4_ = 0x3e2aaaaa;
              auVar350._0_16_ = auVar111;
              auVar350._20_4_ = 0x3e2aaaaa;
              auVar350._24_4_ = 0x3e2aaaaa;
              auVar350._28_4_ = 0x3e2aaaaa;
              auVar97 = ZEXT1632(auVar172);
              auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar97,auVar350);
              auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar97,auVar197);
              auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar367,auVar97);
              auVar229._0_4_ = fVar310 + auVar168._0_4_;
              auVar229._4_4_ = fVar167 + auVar168._4_4_;
              auVar229._8_4_ = fVar330 + auVar168._8_4_;
              auVar229._12_4_ = fVar331 + auVar168._12_4_;
              auVar229._16_4_ = fVar332 + 0.0;
              auVar229._20_4_ = fVar333 + 0.0;
              auVar229._24_4_ = fVar72 + 0.0;
              auVar229._28_4_ = fVar108 + 0.0;
              auVar168._0_4_ = (int)auVar99._0_4_;
              auVar168._4_4_ = (int)auVar99._4_4_;
              auVar168._8_4_ = (int)auVar99._8_4_;
              auVar168._12_4_ = (int)auVar99._12_4_;
              auVar98._16_4_ = (int)auVar99._16_4_;
              auVar98._0_16_ = auVar168;
              auVar98._20_4_ = (int)auVar99._20_4_;
              auVar98._24_4_ = (int)auVar99._24_4_;
              auVar98._28_4_ = (int)auVar99._28_4_;
              auVar172 = vpslld_avx(auVar168,0x17);
              auVar168 = vpslld_avx(auVar98._16_16_,0x17);
              auVar360._8_4_ = 0x3f800000;
              auVar360._0_8_ = 0x3f8000003f800000;
              auVar360._12_4_ = 0x3f800000;
              auVar168 = vpaddd_avx(auVar168,auVar360);
              auVar172 = vpaddd_avx(auVar172,auVar360);
              auVar99._16_16_ = auVar168;
              auVar99._0_16_ = auVar172;
              auVar59 = vfmadd213ps_fma(auVar99,auVar229,auVar250);
              auVar155._8_4_ = 0x800000;
              auVar155._0_8_ = 0x80000000800000;
              auVar155._12_4_ = 0x800000;
              auVar155._16_4_ = 0x800000;
              auVar155._20_4_ = 0x800000;
              auVar155._24_4_ = 0x800000;
              auVar155._28_4_ = 0x800000;
              auVar99 = vmaxps_avx(ZEXT1632(auVar59),auVar155);
              auVar172 = vpsrld_avx(auVar99._0_16_,0x17);
              auVar168 = vpsrld_avx(auVar99._16_16_,0x17);
              auVar278._8_4_ = 0x807fffff;
              auVar278._0_8_ = 0x807fffff807fffff;
              auVar278._12_4_ = 0x807fffff;
              auVar278._16_4_ = 0x807fffff;
              auVar278._20_4_ = 0x807fffff;
              auVar278._24_4_ = 0x807fffff;
              auVar278._28_4_ = 0x807fffff;
              auVar99 = vandps_avx(auVar278,auVar99);
              auVar165 = vorps_avx(auVar99,auVar197);
              auVar279._8_4_ = 0x3f3504f3;
              auVar279._0_8_ = 0x3f3504f33f3504f3;
              auVar279._12_4_ = 0x3f3504f3;
              auVar279._16_4_ = 0x3f3504f3;
              auVar279._20_4_ = 0x3f3504f3;
              auVar279._24_4_ = 0x3f3504f3;
              auVar279._28_4_ = 0x3f3504f3;
              auVar97 = vcmpps_avx(auVar279,auVar165,2);
              auVar99 = vandnps_avx(auVar97,auVar165);
              auVar268._8_4_ = 0xbf800000;
              auVar268._0_8_ = 0xbf800000bf800000;
              auVar268._12_4_ = 0xbf800000;
              auVar268._16_4_ = 0xbf800000;
              auVar268._20_4_ = 0xbf800000;
              auVar268._24_4_ = 0xbf800000;
              auVar268._28_4_ = 0xbf800000;
              auVar156._0_4_ = auVar99._0_4_ + auVar165._0_4_ + -1.0;
              auVar156._4_4_ = auVar99._4_4_ + auVar165._4_4_ + -1.0;
              auVar156._8_4_ = auVar99._8_4_ + auVar165._8_4_ + -1.0;
              auVar156._12_4_ = auVar99._12_4_ + auVar165._12_4_ + -1.0;
              auVar156._16_4_ = auVar99._16_4_ + auVar165._16_4_ + -1.0;
              auVar156._20_4_ = auVar99._20_4_ + auVar165._20_4_ + -1.0;
              auVar156._24_4_ = auVar99._24_4_ + auVar165._24_4_ + -1.0;
              auVar156._28_4_ = auVar99._28_4_ + auVar165._28_4_ + -1.0;
              auVar168 = vpsubd_avx(auVar168,auVar97._16_16_);
              auVar80._8_4_ = 0xffffff81;
              auVar80._0_8_ = 0xffffff81ffffff81;
              auVar80._12_4_ = 0xffffff81;
              auVar168 = vpaddd_avx(auVar80,auVar168);
              auVar172 = vpsubd_avx(auVar172,auVar97._0_16_);
              auVar172 = vpaddd_avx(auVar80,auVar172);
              auVar230._16_16_ = auVar168;
              auVar230._0_16_ = auVar172;
              auVar253._0_4_ = auVar156._0_4_ * auVar156._0_4_;
              auVar253._4_4_ = auVar156._4_4_ * auVar156._4_4_;
              auVar253._8_4_ = auVar156._8_4_ * auVar156._8_4_;
              auVar253._12_4_ = auVar156._12_4_ * auVar156._12_4_;
              auVar253._16_4_ = auVar156._16_4_ * auVar156._16_4_;
              auVar253._20_4_ = auVar156._20_4_ * auVar156._20_4_;
              auVar253._24_4_ = auVar156._24_4_ * auVar156._24_4_;
              auVar253._28_4_ = 0;
              auVar280._8_4_ = 0x3d9021bb;
              auVar280._0_8_ = 0x3d9021bb3d9021bb;
              auVar280._12_4_ = 0x3d9021bb;
              auVar280._16_4_ = 0x3d9021bb;
              auVar280._20_4_ = 0x3d9021bb;
              auVar280._24_4_ = 0x3d9021bb;
              auVar280._28_4_ = 0x3d9021bb;
              auVar300._8_4_ = 0xbdebd1b8;
              auVar300._0_8_ = 0xbdebd1b8bdebd1b8;
              auVar300._12_4_ = 0xbdebd1b8;
              auVar300._16_4_ = 0xbdebd1b8;
              auVar300._20_4_ = 0xbdebd1b8;
              auVar300._24_4_ = 0xbdebd1b8;
              auVar300._28_4_ = 0xbdebd1b8;
              auVar168 = vfmadd213ps_fma(auVar280,auVar156,auVar300);
              auVar301._8_4_ = 0x3def251a;
              auVar301._0_8_ = 0x3def251a3def251a;
              auVar301._12_4_ = 0x3def251a;
              auVar301._16_4_ = 0x3def251a;
              auVar301._20_4_ = 0x3def251a;
              auVar301._24_4_ = 0x3def251a;
              auVar301._28_4_ = 0x3def251a;
              auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar156,auVar301);
              auVar302._8_4_ = 0xbdfe5d4f;
              auVar302._0_8_ = 0xbdfe5d4fbdfe5d4f;
              auVar302._12_4_ = 0xbdfe5d4f;
              auVar302._16_4_ = 0xbdfe5d4f;
              auVar302._20_4_ = 0xbdfe5d4f;
              auVar302._24_4_ = 0xbdfe5d4f;
              auVar302._28_4_ = 0xbdfe5d4f;
              auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar156,auVar302);
              auVar303._8_4_ = 0x3e11e9bf;
              auVar303._0_8_ = 0x3e11e9bf3e11e9bf;
              auVar303._12_4_ = 0x3e11e9bf;
              auVar303._16_4_ = 0x3e11e9bf;
              auVar303._20_4_ = 0x3e11e9bf;
              auVar303._24_4_ = 0x3e11e9bf;
              auVar303._28_4_ = 0x3e11e9bf;
              auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar156,auVar303);
              auVar304._8_4_ = 0xbe2aae50;
              auVar304._0_8_ = 0xbe2aae50be2aae50;
              auVar304._12_4_ = 0xbe2aae50;
              auVar304._16_4_ = 0xbe2aae50;
              auVar304._20_4_ = 0xbe2aae50;
              auVar304._24_4_ = 0xbe2aae50;
              auVar304._28_4_ = 0xbe2aae50;
              auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar156,auVar304);
              auVar305._8_4_ = 0x3e4cceac;
              auVar305._0_8_ = 0x3e4cceac3e4cceac;
              auVar305._12_4_ = 0x3e4cceac;
              auVar305._16_4_ = 0x3e4cceac;
              auVar305._20_4_ = 0x3e4cceac;
              auVar305._24_4_ = 0x3e4cceac;
              auVar305._28_4_ = 0x3e4cceac;
              auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar156,auVar305);
              auVar306._8_4_ = 0xbe7ffffc;
              auVar306._0_8_ = 0xbe7ffffcbe7ffffc;
              auVar306._12_4_ = 0xbe7ffffc;
              auVar306._16_4_ = 0xbe7ffffc;
              auVar306._20_4_ = 0xbe7ffffc;
              auVar306._24_4_ = 0xbe7ffffc;
              auVar306._28_4_ = 0xbe7ffffc;
              auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar156,auVar306);
              auVar307._8_4_ = 0x3eaaaaaa;
              auVar307._0_8_ = 0x3eaaaaaa3eaaaaaa;
              auVar307._12_4_ = 0x3eaaaaaa;
              auVar307._16_4_ = 0x3eaaaaaa;
              auVar307._20_4_ = 0x3eaaaaaa;
              auVar307._24_4_ = 0x3eaaaaaa;
              auVar307._28_4_ = 0x3eaaaaaa;
              auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar156,auVar307);
              auVar281._0_4_ = auVar253._0_4_ * auVar156._0_4_ * auVar168._0_4_;
              auVar281._4_4_ = auVar253._4_4_ * auVar156._4_4_ * auVar168._4_4_;
              auVar281._8_4_ = auVar253._8_4_ * auVar156._8_4_ * auVar168._8_4_;
              auVar281._12_4_ = auVar253._12_4_ * auVar156._12_4_ * auVar168._12_4_;
              auVar281._16_4_ = auVar253._16_4_ * auVar156._16_4_ * 0.0;
              auVar281._20_4_ = auVar253._20_4_ * auVar156._20_4_ * 0.0;
              auVar281._24_4_ = auVar253._24_4_ * auVar156._24_4_ * 0.0;
              auVar281._28_4_ = 0;
              auVar97 = vcvtdq2ps_avx(auVar230);
              auVar168 = vfmadd231ps_fma(auVar281,auVar97,auVar343);
              auVar168 = vfmsub231ps_fma(ZEXT1632(auVar168),auVar197,auVar253);
              auVar99 = vcmpps_avx(ZEXT1632(auVar59),_DAT_00597120,2);
              auVar165 = vsubps_avx(ZEXT1632(auVar168),auVar156);
              auVar168 = vfmsub231ps_fma(auVar165,auVar357,auVar97);
              auVar308._8_4_ = 0xc0000000;
              auVar308._0_8_ = 0xc0000000c0000000;
              auVar308._12_4_ = 0xc0000000;
              auVar308._16_4_ = 0xc0000000;
              auVar308._20_4_ = 0xc0000000;
              auVar308._24_4_ = 0xc0000000;
              auVar308._28_4_ = 0xc0000000;
              auVar157._0_4_ = auVar168._0_4_ * -2.0;
              auVar157._4_4_ = auVar168._4_4_ * -2.0;
              auVar157._8_4_ = auVar168._8_4_ * -2.0;
              auVar157._12_4_ = auVar168._12_4_ * -2.0;
              auVar157._16_4_ = 0x80000000;
              auVar157._20_4_ = 0x80000000;
              auVar157._24_4_ = 0x80000000;
              auVar157._28_4_ = 0;
              auVar231._8_4_ = 0x7fffffff;
              auVar231._0_8_ = 0x7fffffff7fffffff;
              auVar231._12_4_ = 0x7fffffff;
              auVar231._16_4_ = 0x7fffffff;
              auVar231._20_4_ = 0x7fffffff;
              auVar231._24_4_ = 0x7fffffff;
              auVar231._28_4_ = 0x7fffffff;
              auVar99 = vblendvps_avx(auVar157,auVar231,auVar99);
              auVar158._8_4_ = 0x42b0c0a5;
              auVar158._0_8_ = 0x42b0c0a542b0c0a5;
              auVar158._12_4_ = 0x42b0c0a5;
              auVar158._16_4_ = 0x42b0c0a5;
              auVar158._20_4_ = 0x42b0c0a5;
              auVar158._24_4_ = 0x42b0c0a5;
              auVar158._28_4_ = 0x42b0c0a5;
              auVar99 = vminps_avx(auVar99,auVar158);
              auVar159._8_4_ = 0xc2b0c0a5;
              auVar159._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar159._12_4_ = 0xc2b0c0a5;
              auVar159._16_4_ = 0xc2b0c0a5;
              auVar159._20_4_ = 0xc2b0c0a5;
              auVar159._24_4_ = 0xc2b0c0a5;
              auVar159._28_4_ = 0xc2b0c0a5;
              auVar97 = vmaxps_avx(auVar99,auVar159);
              auVar160._8_4_ = 0x3fb8aa3b;
              auVar160._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar160._12_4_ = 0x3fb8aa3b;
              auVar160._16_4_ = 0x3fb8aa3b;
              auVar160._20_4_ = 0x3fb8aa3b;
              auVar160._24_4_ = 0x3fb8aa3b;
              auVar160._28_4_ = 0x3fb8aa3b;
              auVar168 = vfmadd213ps_fma(auVar160,auVar97,auVar197);
              auVar165 = vroundps_avx(ZEXT1632(auVar168),1);
              auVar99 = vcmpps_avx(ZEXT1632(auVar168),auVar165,1);
              auVar99 = vandps_avx(auVar250,auVar99);
              auVar99 = vsubps_avx(auVar165,auVar99);
              auVar168 = vfmsub231ps_fma(auVar97,auVar99,auVar357);
              auVar172 = vfnmsub231ps_fma(ZEXT1632(auVar168),auVar99,auVar343);
              auVar97 = ZEXT1632(auVar172);
              auVar28._28_4_ = auVar165._28_4_;
              auVar28._0_28_ =
                   ZEXT1628(CONCAT412(auVar172._12_4_ * auVar172._12_4_,
                                      CONCAT48(auVar172._8_4_ * auVar172._8_4_,
                                               CONCAT44(auVar172._4_4_ * auVar172._4_4_,
                                                        auVar172._0_4_ * auVar172._0_4_))));
              auVar107 = ZEXT864(0) << 0x20;
              auVar168 = vfmadd213ps_fma(auVar376,auVar97,auVar368);
              auVar282._8_4_ = 0x3c088908;
              auVar282._0_8_ = 0x3c0889083c088908;
              auVar282._12_4_ = 0x3c088908;
              auVar282._16_4_ = 0x3c088908;
              auVar282._20_4_ = 0x3c088908;
              auVar282._24_4_ = 0x3c088908;
              auVar282._28_4_ = 0x3c088908;
              auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar97,auVar282);
              auVar256 = ZEXT3264(auVar250);
              auVar329._8_4_ = 0x3d2aa9c1;
              auVar329._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar329._12_4_ = 0x3d2aa9c1;
              auVar329._16_4_ = 0x3d2aa9c1;
              auVar329._20_4_ = 0x3d2aa9c1;
              auVar329._24_4_ = 0x3d2aa9c1;
              auVar329._28_4_ = 0x3d2aa9c1;
              auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar97,auVar329);
              auVar97 = ZEXT1632(auVar172);
              auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar97,auVar350);
              auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar97,auVar197);
              auVar59 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar28,auVar97);
              auVar172._0_4_ = (int)auVar99._0_4_;
              auVar172._4_4_ = (int)auVar99._4_4_;
              auVar172._8_4_ = (int)auVar99._8_4_;
              auVar172._12_4_ = (int)auVar99._12_4_;
              auVar100._16_4_ = (int)auVar99._16_4_;
              auVar100._0_16_ = auVar172;
              auVar100._20_4_ = (int)auVar99._20_4_;
              auVar100._24_4_ = (int)auVar99._24_4_;
              auVar100._28_4_ = (int)auVar99._28_4_;
              auVar172 = vpslld_avx(auVar172,0x17);
              auVar168 = vpslld_avx(auVar100._16_16_,0x17);
              auVar168 = vpaddd_avx(auVar168,auVar360);
              auVar172 = vpaddd_avx(auVar172,auVar360);
              auVar101._16_16_ = auVar168;
              auVar101._0_16_ = auVar172;
              auVar161._0_4_ = auVar59._0_4_ + fVar310;
              auVar161._4_4_ = auVar59._4_4_ + fVar167;
              auVar161._8_4_ = auVar59._8_4_ + fVar330;
              auVar161._12_4_ = auVar59._12_4_ + fVar331;
              auVar161._16_4_ = fVar332 + 0.0;
              auVar161._20_4_ = fVar333 + 0.0;
              auVar161._24_4_ = fVar72 + 0.0;
              auVar161._28_4_ = fVar108 + 0.0;
              auVar168 = vfmadd213ps_fma(auVar101,auVar161,auVar250);
              auVar99 = vrcpps_avx(ZEXT1632(auVar168));
              auVar168 = vfmsub213ps_fma(ZEXT1632(auVar168),auVar99,auVar250);
              auVar168 = vfnmadd132ps_fma(ZEXT1632(auVar168),auVar99,auVar99);
              auVar168 = vfnmadd213ps_fma(ZEXT1632(auVar168),auVar308,auVar268);
              auVar91 = ZEXT1628(auVar168);
              goto LAB_002e4b22;
            case 6:
              uVar8 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
              auVar97._4_4_ = uVar8;
              auVar97._0_4_ = uVar8;
              auVar97._8_4_ = uVar8;
              auVar97._12_4_ = uVar8;
              auVar97._16_4_ = uVar8;
              auVar97._20_4_ = uVar8;
              auVar97._24_4_ = uVar8;
              auVar97._28_4_ = uVar8;
              uVar8 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var19))[1];
              auVar165._4_4_ = uVar8;
              auVar165._0_4_ = uVar8;
              auVar165._8_4_ = uVar8;
              auVar165._12_4_ = uVar8;
              auVar165._16_4_ = uVar8;
              auVar165._20_4_ = uVar8;
              auVar165._24_4_ = uVar8;
              auVar165._28_4_ = uVar8;
              auVar168 = vfmadd231ps_fma(auVar165,auVar67,auVar97);
              auVar99 = vmaxps_avx(auVar99,ZEXT1632(auVar168));
              auVar250 = vminps_avx(auVar99,auVar250);
              auVar91 = auVar250._0_28_;
LAB_002e4b22:
              auVar67._4_4_ = auVar91._4_4_ * fVar71;
              auVar67._0_4_ = auVar91._0_4_ * fVar109;
              auVar67._8_4_ = auVar91._8_4_ * auVar67._8_4_;
              auVar67._12_4_ = auVar91._12_4_ * auVar67._12_4_;
              auVar67._16_4_ = auVar91._16_4_ * auVar67._16_4_;
              auVar67._20_4_ = auVar91._20_4_ * auVar67._20_4_;
              auVar67._24_4_ = auVar91._24_4_ * auVar67._24_4_;
            }
            *(undefined1 (*) [32])((long)top_blob->data + uVar34 * 0x20) = auVar67;
            uVar34 = uVar34 + 1;
            lVar40 = lVar40 + local_98;
            lVar44 = lVar44 + local_98;
            lVar46 = lVar46 + local_98;
            lVar49 = lVar49 + local_98;
            local_b0 = local_b0 + local_98;
            lVar39 = lVar39 + local_98;
            local_a8 = local_a8 + local_98;
            local_b8 = local_b8 + local_98;
            local_c0 = top_blob;
            local_88 = (ulong)uVar33;
          } while (uVar34 != local_90);
        }
        uVar34 = local_c8 & 0xfffffffffffffff8;
        if ((uVar36 >> 2 & 1) != 0) {
          if (lVar21 == 0) {
            auVar168 = ZEXT816(0) << 0x40;
          }
          else {
            auVar168 = *(undefined1 (*) [16])(lVar21 + uVar34 * 4);
          }
          pvVar22 = (this->weight_data_tm).data;
          pvVar37 = (void *)((long)pvVar22 + uVar34 * lVar45 * 4);
          if ((int)uVar51 < 8) {
            uVar48 = 0;
            lVar39 = (uVar34 | 1) * lVar45 * 4;
            lVar46 = (uVar34 | 2) * lVar45 * 4;
            lVar40 = (uVar34 | 3) * lVar45 * 4;
            auVar172 = ZEXT816(0);
            auVar59 = ZEXT816(0);
            auVar360 = ZEXT816(0);
            auVar80 = ZEXT816(0);
            pauVar32 = local_138;
          }
          else {
            uVar48 = uVar51 & 0xfffffff8;
            lVar39 = (uVar34 + 3) * lVar45;
            lVar46 = (uVar34 + 2) * lVar45;
            lVar49 = (uVar34 + 1) * lVar45;
            auVar80 = ZEXT816(0);
            iVar31 = 7;
            auVar360 = ZEXT816(0);
            auVar59 = ZEXT816(0);
            auVar172 = ZEXT816(0);
            lVar44 = 0;
            do {
              lVar50 = lVar44;
              auVar250 = *(undefined1 (*) [32])(*local_138 + lVar50);
              auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),auVar250,
                                         *(undefined1 (*) [32])((long)pvVar37 + lVar50));
              auVar59 = vfmadd231ps_fma(ZEXT1632(auVar59),auVar250,
                                        *(undefined1 (*) [32])((long)pvVar22 + lVar50 + lVar49 * 4))
              ;
              auVar360 = vfmadd231ps_fma(ZEXT1632(auVar360),auVar250,
                                         *(undefined1 (*) [32])((long)pvVar22 + lVar50 + lVar46 * 4)
                                        );
              auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar250,
                                        *(undefined1 (*) [32])((long)pvVar22 + lVar50 + lVar39 * 4))
              ;
              iVar31 = iVar31 + 8;
              lVar44 = lVar50 + 0x20;
            } while (iVar31 < (int)uVar51);
            lVar40 = lVar44 + lVar39 * 4;
            lVar46 = lVar44 + lVar46 * 4;
            lVar39 = lVar44 + lVar49 * 4;
            pvVar37 = (void *)((long)pvVar37 + lVar44);
            pauVar32 = (undefined1 (*) [32])(local_138[1] + lVar50);
          }
          lVar39 = (long)pvVar22 + lVar39;
          lVar46 = (long)pvVar22 + lVar46;
          lVar40 = (long)pvVar22 + lVar40;
          auVar58 = ZEXT816(0) << 0x40;
          if ((int)(uVar48 | 3) < (int)uVar51) {
            auVar140 = ZEXT816(0);
            lVar44 = 0;
            auVar89 = ZEXT816(0);
            auVar256 = ZEXT864(0);
            uVar47 = uVar48;
            do {
              auVar141 = *(undefined1 (*) [16])(*pauVar32 + lVar44);
              auVar58 = vfmadd231ps_fma(auVar58,auVar141,
                                        *(undefined1 (*) [16])((long)pvVar37 + lVar44));
              auVar124 = vfmadd231ps_fma(auVar256._0_16_,auVar141,
                                         *(undefined1 (*) [16])(lVar39 + lVar44));
              auVar256 = ZEXT1664(auVar124);
              auVar89 = vfmadd231ps_fma(auVar89,auVar141,*(undefined1 (*) [16])(lVar46 + lVar44));
              auVar140 = vfmadd231ps_fma(auVar140,auVar141,*(undefined1 (*) [16])(lVar40 + lVar44));
              uVar48 = uVar47 + 4;
              iVar31 = uVar47 + 7;
              lVar44 = lVar44 + 0x10;
              uVar47 = uVar48;
            } while (iVar31 < (int)uVar51);
            pauVar32 = (undefined1 (*) [32])(*pauVar32 + lVar44);
            lVar40 = lVar40 + lVar44;
            lVar46 = lVar46 + lVar44;
            lVar39 = lVar39 + lVar44;
            pvVar37 = (void *)((long)pvVar37 + lVar44);
          }
          else {
            auVar124 = SUB6416(ZEXT864(0),0);
            auVar89 = ZEXT816(0);
            auVar140 = ZEXT816(0);
          }
          if (uVar51 - uVar48 != 0 && (int)uVar48 <= (int)uVar51) {
            lVar44 = 0;
            do {
              auVar141 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar37 + lVar44 * 4)),
                                       ZEXT416(*(uint *)(lVar39 + lVar44 * 4)),0x10);
              auVar141 = vinsertps_avx(auVar141,ZEXT416(*(uint *)(lVar46 + lVar44 * 4)),0x20);
              auVar141 = vinsertps_avx(auVar141,ZEXT416(*(uint *)(lVar40 + lVar44 * 4)),0x30);
              uVar8 = *(undefined4 *)(*pauVar32 + lVar44 * 4);
              auVar313._4_4_ = uVar8;
              auVar313._0_4_ = uVar8;
              auVar313._8_4_ = uVar8;
              auVar313._12_4_ = uVar8;
              auVar168 = vfmadd231ps_fma(auVar168,auVar141,auVar313);
              lVar44 = lVar44 + 1;
            } while (uVar51 - uVar48 != (int)lVar44);
          }
          auVar250 = vhaddps_avx(ZEXT1632(auVar172),ZEXT1632(auVar59));
          auVar99 = vhaddps_avx(ZEXT1632(auVar360),ZEXT1632(auVar80));
          auVar250 = vhaddps_avx(auVar250,auVar99);
          auVar360 = vunpcklps_avx(auVar58,auVar124);
          auVar80 = vunpcklps_avx(auVar89,auVar140);
          auVar59 = vunpckhps_avx(auVar58,auVar124);
          auVar58 = vunpckhps_avx(auVar89,auVar140);
          auVar172 = vmovlhps_avx(auVar360,auVar80);
          auVar80 = vunpckhpd_avx(auVar360,auVar80);
          auVar360 = vmovlhps_avx(auVar59,auVar58);
          auVar58 = vunpckhpd_avx(auVar59,auVar58);
          auVar59._0_4_ =
               auVar80._0_4_ + auVar172._0_4_ + auVar360._0_4_ + auVar58._0_4_ + auVar250._0_4_ +
               auVar250._16_4_ + auVar168._0_4_;
          auVar59._4_4_ =
               auVar80._4_4_ + auVar172._4_4_ + auVar360._4_4_ + auVar58._4_4_ + auVar250._4_4_ +
               auVar250._20_4_ + auVar168._4_4_;
          auVar59._8_4_ =
               auVar80._8_4_ + auVar172._8_4_ + auVar360._8_4_ + auVar58._8_4_ + auVar250._8_4_ +
               auVar250._24_4_ + auVar168._8_4_;
          auVar59._12_4_ =
               auVar80._12_4_ + auVar172._12_4_ + auVar360._12_4_ + auVar58._12_4_ + auVar250._12_4_
               + auVar250._28_4_ + auVar168._12_4_;
          switch(uVar33) {
          case 1:
            auVar30._12_4_ = 0;
            auVar30._0_12_ = ZEXT412(0);
            auVar59 = vmaxps_avx(auVar59,auVar30 << 0x20);
            break;
          case 2:
            auVar168 = vmaxps_avx(auVar59,ZEXT416(0) << 0x20);
            auVar172 = vminps_avx(auVar59,ZEXT416(0) << 0x20);
            uVar8 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
            auVar63._4_4_ = uVar8;
            auVar63._0_4_ = uVar8;
            auVar63._8_4_ = uVar8;
            auVar63._12_4_ = uVar8;
            auVar59 = vfmadd213ps_fma(auVar63,auVar172,auVar168);
            break;
          case 3:
            uVar8 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
            auVar84._4_4_ = uVar8;
            auVar84._0_4_ = uVar8;
            auVar84._8_4_ = uVar8;
            auVar84._12_4_ = uVar8;
            uVar8 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var19))[1];
            auVar137._4_4_ = uVar8;
            auVar137._0_4_ = uVar8;
            auVar137._8_4_ = uVar8;
            auVar137._12_4_ = uVar8;
            auVar168 = vmaxps_avx(auVar59,auVar84);
            auVar59 = vminps_avx(auVar168,auVar137);
            break;
          case 4:
            uVar41 = CONCAT44(auVar59._4_4_,auVar59._0_4_);
            auVar60._0_8_ = uVar41 ^ 0x8000000080000000;
            auVar60._8_4_ = -auVar59._8_4_;
            auVar60._12_4_ = -auVar59._12_4_;
            auVar85._8_4_ = 0x42b0c0a5;
            auVar85._0_8_ = 0x42b0c0a542b0c0a5;
            auVar85._12_4_ = 0x42b0c0a5;
            auVar168 = vminps_avx(auVar60,auVar85);
            auVar86._8_4_ = 0xc2b0c0a5;
            auVar86._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar86._12_4_ = 0xc2b0c0a5;
            auVar59 = vmaxps_avx(auVar168,auVar86);
            auVar87._8_4_ = 0x3fb8aa3b;
            auVar87._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar87._12_4_ = 0x3fb8aa3b;
            auVar138._8_4_ = 0x3f000000;
            auVar138._0_8_ = 0x3f0000003f000000;
            auVar138._12_4_ = 0x3f000000;
            auVar168 = vfmadd213ps_fma(auVar87,auVar59,auVar138);
            auVar183._0_4_ = (int)auVar168._0_4_;
            auVar183._4_4_ = (int)auVar168._4_4_;
            auVar183._8_4_ = (int)auVar168._8_4_;
            auVar183._12_4_ = (int)auVar168._12_4_;
            auVar172 = vcvtdq2ps_avx(auVar183);
            auVar168 = vcmpps_avx(auVar168,auVar172,1);
            auVar88._8_4_ = 0x3f800000;
            auVar88._0_8_ = 0x3f8000003f800000;
            auVar88._12_4_ = 0x3f800000;
            auVar168 = vandps_avx(auVar168,auVar88);
            auVar168 = vsubps_avx(auVar172,auVar168);
            auVar223._8_4_ = 0x3f318000;
            auVar223._0_8_ = 0x3f3180003f318000;
            auVar223._12_4_ = 0x3f318000;
            auVar172 = vfmsub213ps_fma(auVar223,auVar168,auVar59);
            auVar61._8_4_ = 0x395e8083;
            auVar61._0_8_ = 0x395e8083395e8083;
            auVar61._12_4_ = 0x395e8083;
            auVar59 = vfmsub213ps_fma(auVar61,auVar168,auVar172);
            auVar224._0_4_ = auVar59._0_4_ * auVar59._0_4_;
            auVar224._4_4_ = auVar59._4_4_ * auVar59._4_4_;
            auVar224._8_4_ = auVar59._8_4_ * auVar59._8_4_;
            auVar224._12_4_ = auVar59._12_4_ * auVar59._12_4_;
            auVar235._8_4_ = 0x3ab743ce;
            auVar235._0_8_ = 0x3ab743ce3ab743ce;
            auVar235._12_4_ = 0x3ab743ce;
            auVar247._8_4_ = 0x39506967;
            auVar247._0_8_ = 0x3950696739506967;
            auVar247._12_4_ = 0x39506967;
            auVar172 = vfmadd213ps_fma(auVar247,auVar59,auVar235);
            auVar236._8_4_ = 0x3c088908;
            auVar236._0_8_ = 0x3c0889083c088908;
            auVar236._12_4_ = 0x3c088908;
            auVar172 = vfmadd231ps_fma(auVar236,auVar59,auVar172);
            auVar248._8_4_ = 0x3d2aa9c1;
            auVar248._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar248._12_4_ = 0x3d2aa9c1;
            auVar172 = vfmadd231ps_fma(auVar248,auVar59,auVar172);
            auVar237._8_4_ = 0x3e2aaaaa;
            auVar237._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar237._12_4_ = 0x3e2aaaaa;
            auVar172 = vfmadd231ps_fma(auVar237,auVar59,auVar172);
            auVar172 = vfmadd213ps_fma(auVar172,auVar59,auVar138);
            auVar172 = vfmadd213ps_fma(auVar172,auVar224,auVar59);
            auVar139._0_4_ = auVar172._0_4_ + 1.0;
            auVar139._4_4_ = auVar172._4_4_ + 1.0;
            auVar139._8_4_ = auVar172._8_4_ + 1.0;
            auVar139._12_4_ = auVar172._12_4_ + 1.0;
            auVar62._0_4_ = (int)auVar168._0_4_;
            auVar62._4_4_ = (int)auVar168._4_4_;
            auVar62._8_4_ = (int)auVar168._8_4_;
            auVar62._12_4_ = (int)auVar168._12_4_;
            auVar168 = vpslld_avx(auVar62,0x17);
            auVar168 = vpaddd_avx(auVar168,auVar88);
            auVar172 = vfmadd213ps_fma(auVar168,auVar139,auVar88);
            auVar168 = vrcpps_avx(auVar172);
            auVar172 = vfmsub213ps_fma(auVar172,auVar168,auVar88);
            auVar59 = vfnmadd132ps_fma(auVar172,auVar168,auVar168);
            break;
          case 5:
            auVar81._8_4_ = 0x42b0c0a5;
            auVar81._0_8_ = 0x42b0c0a542b0c0a5;
            auVar81._12_4_ = 0x42b0c0a5;
            auVar111 = vminps_avx(auVar59,auVar81);
            auVar125._8_4_ = 0xc2b0c0a5;
            auVar125._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar125._12_4_ = 0xc2b0c0a5;
            auVar172 = vmaxps_avx(auVar111,auVar125);
            auVar234._8_4_ = 0x3fb8aa3b;
            auVar234._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar234._12_4_ = 0x3fb8aa3b;
            auVar258._8_4_ = 0x3f000000;
            auVar258._0_8_ = 0x3f0000003f000000;
            auVar258._12_4_ = 0x3f000000;
            auVar111 = vfmadd213ps_fma(auVar234,auVar172,auVar258);
            auVar180._0_4_ = (int)auVar111._0_4_;
            auVar180._4_4_ = (int)auVar111._4_4_;
            auVar180._8_4_ = (int)auVar111._8_4_;
            auVar180._12_4_ = (int)auVar111._12_4_;
            auVar168 = vcvtdq2ps_avx(auVar180);
            auVar111 = vcmpps_avx(auVar111,auVar168,1);
            auVar246._8_4_ = 0x3f800000;
            auVar246._0_8_ = 0x3f8000003f800000;
            auVar246._12_4_ = 0x3f800000;
            auVar111 = vandps_avx(auVar111,auVar246);
            auVar168 = vsubps_avx(auVar168,auVar111);
            auVar181._8_4_ = 0x3f318000;
            auVar181._0_8_ = 0x3f3180003f318000;
            auVar181._12_4_ = 0x3f318000;
            auVar111 = vfmsub231ps_fma(auVar172,auVar168,auVar181);
            auVar275._8_4_ = 0xb95e8083;
            auVar275._0_8_ = 0xb95e8083b95e8083;
            auVar275._12_4_ = 0xb95e8083;
            auVar360 = vfnmsub231ps_fma(auVar111,auVar168,auVar275);
            auVar371._0_4_ = auVar360._0_4_ * auVar360._0_4_;
            auVar371._4_4_ = auVar360._4_4_ * auVar360._4_4_;
            auVar371._8_4_ = auVar360._8_4_ * auVar360._8_4_;
            auVar371._12_4_ = auVar360._12_4_ * auVar360._12_4_;
            auVar126._8_4_ = 0x3ab743ce;
            auVar126._0_8_ = 0x3ab743ce3ab743ce;
            auVar126._12_4_ = 0x3ab743ce;
            auVar82._8_4_ = 0x39506967;
            auVar82._0_8_ = 0x3950696739506967;
            auVar82._12_4_ = 0x39506967;
            auVar111 = vfmadd213ps_fma(auVar82,auVar360,auVar126);
            auVar314._8_4_ = 0x3c088908;
            auVar314._0_8_ = 0x3c0889083c088908;
            auVar314._12_4_ = 0x3c088908;
            auVar111 = vfmadd213ps_fma(auVar111,auVar360,auVar314);
            auVar336._8_4_ = 0x3d2aa9c1;
            auVar336._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar336._12_4_ = 0x3d2aa9c1;
            auVar172 = vfmadd213ps_fma(auVar111,auVar360,auVar336);
            auVar111._8_4_ = 0x3e2aaaaa;
            auVar111._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar111._12_4_ = 0x3e2aaaaa;
            auVar172 = vfmadd213ps_fma(auVar172,auVar360,auVar111);
            auVar172 = vfmadd213ps_fma(auVar172,auVar360,auVar258);
            auVar172 = vfmadd213ps_fma(auVar172,auVar371,auVar360);
            auVar211._0_4_ = auVar172._0_4_ + 1.0;
            auVar211._4_4_ = auVar172._4_4_ + 1.0;
            auVar211._8_4_ = auVar172._8_4_ + 1.0;
            auVar211._12_4_ = auVar172._12_4_ + 1.0;
            auVar359._0_4_ = (int)auVar168._0_4_;
            auVar359._4_4_ = (int)auVar168._4_4_;
            auVar359._8_4_ = (int)auVar168._8_4_;
            auVar359._12_4_ = (int)auVar168._12_4_;
            auVar168 = vpslld_avx(auVar359,0x17);
            auVar168 = vpaddd_avx(auVar168,auVar246);
            auVar168 = vfmadd213ps_fma(auVar168,auVar211,auVar246);
            auVar172 = vcmpps_avx(auVar168,ZEXT816(0) << 0x40,2);
            auVar212._8_4_ = 0x800000;
            auVar212._0_8_ = 0x80000000800000;
            auVar212._12_4_ = 0x800000;
            auVar168 = vmaxps_avx(auVar168,auVar212);
            auVar360 = vpsrld_avx(auVar168,0x17);
            auVar372._8_4_ = 0x807fffff;
            auVar372._0_8_ = 0x807fffff807fffff;
            auVar372._12_4_ = 0x807fffff;
            auVar168 = vandps_avx(auVar372,auVar168);
            auVar80 = vorps_avx(auVar168,auVar258);
            auVar373._8_4_ = 0xffffff82;
            auVar373._0_8_ = 0xffffff82ffffff82;
            auVar373._12_4_ = 0xffffff82;
            auVar58 = vpaddd_avx(auVar360,auVar373);
            auVar361._8_4_ = 0x3f3504f3;
            auVar361._0_8_ = 0x3f3504f33f3504f3;
            auVar361._12_4_ = 0x3f3504f3;
            auVar360 = vcmpps_avx(auVar80,auVar361,1);
            auVar168 = vandps_avx(auVar360,auVar80);
            auVar362._0_4_ = auVar80._0_4_ + -1.0 + auVar168._0_4_;
            auVar362._4_4_ = auVar80._4_4_ + -1.0 + auVar168._4_4_;
            auVar362._8_4_ = auVar80._8_4_ + -1.0 + auVar168._8_4_;
            auVar362._12_4_ = auVar80._12_4_ + -1.0 + auVar168._12_4_;
            auVar80 = vcvtdq2ps_avx(auVar58);
            auVar168 = vandps_avx(auVar360,auVar246);
            auVar168 = vsubps_avx(auVar80,auVar168);
            auVar127._8_4_ = 0xbdebd1b8;
            auVar127._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar127._12_4_ = 0xbdebd1b8;
            auVar213._8_4_ = 0x3d9021bb;
            auVar213._0_8_ = 0x3d9021bb3d9021bb;
            auVar213._12_4_ = 0x3d9021bb;
            auVar360 = vfmadd213ps_fma(auVar213,auVar362,auVar127);
            auVar128._8_4_ = 0x3def251a;
            auVar128._0_8_ = 0x3def251a3def251a;
            auVar128._12_4_ = 0x3def251a;
            auVar360 = vfmadd231ps_fma(auVar128,auVar362,auVar360);
            auVar214._8_4_ = 0xbdfe5d4f;
            auVar214._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar214._12_4_ = 0xbdfe5d4f;
            auVar360 = vfmadd231ps_fma(auVar214,auVar362,auVar360);
            auVar129._8_4_ = 0x3e11e9bf;
            auVar129._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar129._12_4_ = 0x3e11e9bf;
            auVar360 = vfmadd231ps_fma(auVar129,auVar362,auVar360);
            auVar215._8_4_ = 0xbe2aae50;
            auVar215._0_8_ = 0xbe2aae50be2aae50;
            auVar215._12_4_ = 0xbe2aae50;
            auVar360 = vfmadd231ps_fma(auVar215,auVar362,auVar360);
            auVar130._8_4_ = 0x3e4cceac;
            auVar130._0_8_ = 0x3e4cceac3e4cceac;
            auVar130._12_4_ = 0x3e4cceac;
            auVar360 = vfmadd231ps_fma(auVar130,auVar362,auVar360);
            auVar216._8_4_ = 0xbe7ffffc;
            auVar216._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar216._12_4_ = 0xbe7ffffc;
            auVar360 = vfmadd231ps_fma(auVar216,auVar362,auVar360);
            auVar131._8_4_ = 0x3eaaaaaa;
            auVar131._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar131._12_4_ = 0x3eaaaaaa;
            auVar360 = vfmadd231ps_fma(auVar131,auVar362,auVar360);
            auVar217._0_4_ = auVar362._0_4_ * auVar362._0_4_;
            auVar217._4_4_ = auVar362._4_4_ * auVar362._4_4_;
            auVar217._8_4_ = auVar362._8_4_ * auVar362._8_4_;
            auVar217._12_4_ = auVar362._12_4_ * auVar362._12_4_;
            auVar132._0_4_ = auVar362._0_4_ * auVar217._0_4_ * auVar360._0_4_;
            auVar132._4_4_ = auVar362._4_4_ * auVar217._4_4_ * auVar360._4_4_;
            auVar132._8_4_ = auVar362._8_4_ * auVar217._8_4_ * auVar360._8_4_;
            auVar132._12_4_ = auVar362._12_4_ * auVar217._12_4_ * auVar360._12_4_;
            auVar360 = vfmadd231ps_fma(auVar132,auVar168,auVar275);
            auVar360 = vfmsub231ps_fma(auVar360,auVar258,auVar217);
            auVar360 = vsubps_avx(auVar360,auVar362);
            auVar168 = vfnmadd231ps_fma(auVar360,auVar181,auVar168);
            auVar133._0_4_ = auVar168._0_4_ + auVar168._0_4_;
            auVar133._4_4_ = auVar168._4_4_ + auVar168._4_4_;
            auVar133._8_4_ = auVar168._8_4_ + auVar168._8_4_;
            auVar133._12_4_ = auVar168._12_4_ + auVar168._12_4_;
            auVar218._8_4_ = 0x7fffffff;
            auVar218._0_8_ = 0x7fffffff7fffffff;
            auVar218._12_4_ = 0x7fffffff;
            auVar168 = vblendvps_avx(auVar133,auVar218,auVar172);
            auVar219._8_4_ = 0x42b0c0a5;
            auVar219._0_8_ = 0x42b0c0a542b0c0a5;
            auVar219._12_4_ = 0x42b0c0a5;
            auVar168 = vminps_avx(auVar168,auVar219);
            auVar220._8_4_ = 0xc2b0c0a5;
            auVar220._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar220._12_4_ = 0xc2b0c0a5;
            auVar360 = vmaxps_avx(auVar168,auVar220);
            auVar168 = vfmadd213ps_fma(auVar234,auVar360,auVar258);
            auVar221._0_4_ = (int)auVar168._0_4_;
            auVar221._4_4_ = (int)auVar168._4_4_;
            auVar221._8_4_ = (int)auVar168._8_4_;
            auVar221._12_4_ = (int)auVar168._12_4_;
            auVar172 = vcvtdq2ps_avx(auVar221);
            auVar168 = vcmpps_avx(auVar168,auVar172,1);
            auVar168 = vandps_avx(auVar168,auVar246);
            auVar168 = vsubps_avx(auVar172,auVar168);
            auVar172 = vfmsub213ps_fma(auVar181,auVar168,auVar360);
            auVar360 = vfnmsub231ps_fma(auVar172,auVar168,auVar275);
            auVar134._8_4_ = 0x3ab743ce;
            auVar134._0_8_ = 0x3ab743ce3ab743ce;
            auVar134._12_4_ = 0x3ab743ce;
            auVar172 = vfmadd213ps_fma(auVar82,auVar360,auVar134);
            auVar172 = vfmadd213ps_fma(auVar172,auVar360,auVar314);
            auVar172 = vfmadd213ps_fma(auVar172,auVar360,auVar336);
            auVar172 = vfmadd213ps_fma(auVar172,auVar360,auVar111);
            auVar172 = vfmadd213ps_fma(auVar172,auVar360,auVar258);
            auVar135._0_4_ = auVar360._0_4_ * auVar360._0_4_;
            auVar135._4_4_ = auVar360._4_4_ * auVar360._4_4_;
            auVar135._8_4_ = auVar360._8_4_ * auVar360._8_4_;
            auVar135._12_4_ = auVar360._12_4_ * auVar360._12_4_;
            auVar172 = vfmadd213ps_fma(auVar172,auVar135,auVar360);
            auVar83._0_4_ = auVar172._0_4_ + 1.0;
            auVar83._4_4_ = auVar172._4_4_ + 1.0;
            auVar83._8_4_ = auVar172._8_4_ + 1.0;
            auVar83._12_4_ = auVar172._12_4_ + 1.0;
            auVar136._0_4_ = (int)auVar168._0_4_;
            auVar136._4_4_ = (int)auVar168._4_4_;
            auVar136._8_4_ = (int)auVar168._8_4_;
            auVar136._12_4_ = (int)auVar168._12_4_;
            auVar168 = vpslld_avx(auVar136,0x17);
            auVar168 = vpaddd_avx(auVar168,auVar246);
            auVar172 = vfmadd213ps_fma(auVar168,auVar83,auVar246);
            auVar168 = vrcpps_avx(auVar172);
            auVar182._0_4_ = auVar168._0_4_ + auVar168._0_4_;
            auVar182._4_4_ = auVar168._4_4_ + auVar168._4_4_;
            auVar182._8_4_ = auVar168._8_4_ + auVar168._8_4_;
            auVar182._12_4_ = auVar168._12_4_ + auVar168._12_4_;
            auVar222._8_4_ = 0x40000000;
            auVar222._0_8_ = 0x4000000040000000;
            auVar222._12_4_ = 0x40000000;
            auVar172 = vfmsub231ps_fma(auVar222,auVar182,auVar172);
            auVar168 = vfnmadd213ps_fma(auVar172,auVar168,auVar182);
            auVar59 = vfmsub231ps_fma(auVar59,auVar59,auVar168);
            break;
          case 6:
            uVar8 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
            auVar89._4_4_ = uVar8;
            auVar89._0_4_ = uVar8;
            auVar89._8_4_ = uVar8;
            auVar89._12_4_ = uVar8;
            uVar8 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var19))[1];
            auVar140._4_4_ = uVar8;
            auVar140._0_4_ = uVar8;
            auVar140._8_4_ = uVar8;
            auVar140._12_4_ = uVar8;
            auVar168 = vfmadd231ps_fma(auVar140,auVar59,auVar89);
            auVar168 = vmaxps_avx(auVar168,ZEXT416(0) << 0x20);
            auVar141._8_4_ = 0x3f800000;
            auVar141._0_8_ = 0x3f8000003f800000;
            auVar141._12_4_ = 0x3f800000;
            auVar168 = vminps_avx(auVar168,auVar141);
            auVar59._0_4_ = auVar168._0_4_ * auVar59._0_4_;
            auVar59._4_4_ = auVar168._4_4_ * auVar59._4_4_;
            auVar59._8_4_ = auVar168._8_4_ * auVar59._8_4_;
            auVar59._12_4_ = auVar168._12_4_ * auVar59._12_4_;
          }
          *(undefined1 (*) [16])((long)top_blob->data + uVar34 * 4) = auVar59;
        }
        iVar31 = (int)uVar34 + (uVar36 >> 2 & 1) * 4;
        local_d0 = this;
        if (iVar31 < (int)uVar36) {
          pvVar37 = (this->weight_data_tm).data;
          pfVar23 = *(float **)(&this->field_0xe8 + (long)p_Var19);
          pvVar22 = top_blob->data;
          local_148 = uVar51 & 0xfffffff8;
          uVar34 = (ulong)iVar31;
          auVar107 = ZEXT3264(_DAT_00594fc0);
          auVar166 = ZEXT3264(_DAT_00594fe0);
          local_e8._8_8_ = 0x8000000000000000;
          local_e8._0_8_ = 0x8000000000000000;
          auVar201 = ZEXT1664(local_e8);
          auVar111 = vpcmpeqd_avx(auVar111,auVar111);
          auVar256 = ZEXT1664(auVar111);
          do {
            auVar111 = ZEXT816(0) << 0x40;
            if (lVar21 != 0) {
              auVar111 = ZEXT416(*(uint *)(lVar21 + uVar34 * 4));
            }
            pauVar32 = (undefined1 (*) [32])((long)pvVar37 + uVar34 * lVar45 * 4);
            pauVar35 = pauVar43;
            if ((int)uVar51 < 8) {
              auVar250 = SUB6432(ZEXT864(0),0);
              uVar36 = 0;
            }
            else {
              auVar377 = ZEXT864(0);
              iVar31 = 7;
              do {
                auVar168 = vfmadd231ps_fma(auVar377._0_32_,*pauVar35,*pauVar32);
                auVar377 = ZEXT1664(auVar168);
                auVar250 = ZEXT1632(auVar168);
                pauVar35 = pauVar35 + 1;
                pauVar32 = pauVar32 + 1;
                iVar31 = iVar31 + 8;
                uVar36 = local_148;
              } while (iVar31 < (int)uVar51);
            }
            auVar168 = ZEXT816(0) << 0x40;
            uVar48 = uVar36 | 3;
            while ((int)uVar48 < (int)uVar51) {
              auVar168 = vfmadd231ps_fma(auVar168,*(undefined1 (*) [16])*pauVar35,
                                         *(undefined1 (*) [16])*pauVar32);
              pauVar35 = (undefined1 (*) [32])(*pauVar35 + 0x10);
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
              uVar48 = uVar36 + 7;
              uVar36 = uVar36 + 4;
            }
            auVar172 = auVar201._0_16_;
            if ((int)uVar36 < (int)uVar51) {
              uVar41 = CONCAT44(0,~uVar36 + uVar51);
              auVar111 = vblendps_avx(auVar111,_DAT_00592020,0xe);
              auVar184._8_8_ = 0;
              auVar184._0_8_ = uVar41;
              auVar80 = vpshufd_avx(auVar184,0x44);
              auVar59 = vorps_avx(auVar172,auVar80);
              auVar360 = vorps_avx(auVar172,auVar80);
              uVar42 = 0;
              do {
                auVar140 = auVar111;
                auVar238._8_8_ = 0;
                auVar238._0_8_ = uVar42;
                auVar111 = vpshufd_avx(auVar238,0x44);
                auVar269._16_16_ = auVar111;
                auVar269._0_16_ = auVar111;
                auVar99 = vorps_avx(auVar107._0_32_,auVar269);
                auVar67 = vorps_avx(auVar166._0_32_,auVar269);
                auVar111 = vorps_avx(auVar80,auVar172);
                uVar36 = auVar201._0_4_;
                auVar276._0_4_ = auVar67._16_4_ ^ uVar36;
                uVar48 = auVar201._4_4_;
                auVar276._4_4_ = auVar67._20_4_ ^ uVar48;
                uVar47 = auVar201._8_4_;
                auVar276._8_4_ = auVar67._24_4_ ^ uVar47;
                uVar24 = auVar201._12_4_;
                auVar276._12_4_ = auVar67._28_4_ ^ uVar24;
                auVar124 = vpcmpgtq_avx(auVar276,auVar111);
                auVar315._0_4_ = uVar36 ^ auVar67._0_4_;
                auVar315._4_4_ = uVar48 ^ auVar67._4_4_;
                auVar315._8_4_ = uVar47 ^ auVar67._8_4_;
                auVar315._12_4_ = uVar24 ^ auVar67._12_4_;
                auVar58 = vpcmpgtq_avx(auVar315,auVar59);
                auVar58 = vpackssdw_avx(auVar58,auVar124);
                auVar337._0_4_ = auVar99._16_4_ ^ uVar36;
                auVar337._4_4_ = auVar99._20_4_ ^ uVar48;
                auVar337._8_4_ = auVar99._24_4_ ^ uVar47;
                auVar337._12_4_ = auVar99._28_4_ ^ uVar24;
                auVar89 = vpcmpgtq_avx(auVar337,auVar111);
                auVar338._0_4_ = uVar36 ^ auVar99._0_4_;
                auVar338._4_4_ = uVar48 ^ auVar99._4_4_;
                auVar338._8_4_ = uVar47 ^ auVar99._8_4_;
                auVar338._12_4_ = uVar24 ^ auVar99._12_4_;
                auVar111 = vpcmpgtq_avx(auVar338,auVar360);
                auVar111 = vpackssdw_avx(auVar111,auVar89);
                auVar111 = vpackssdw_avx(auVar111 ^ auVar256._0_16_,auVar58 ^ auVar256._0_16_);
                auVar58 = vpmovsxwd_avx(auVar111);
                auVar111 = vpunpckhwd_avx(auVar111,auVar111);
                auVar344._16_16_ = auVar111;
                auVar344._0_16_ = auVar58;
                auVar97 = vmaskmovps_avx(auVar344,*(undefined1 (*) [32])(*pauVar35 + uVar42 * 4));
                auVar165 = vmaskmovps_avx(auVar344,*(undefined1 (*) [32])(*pauVar32 + uVar42 * 4));
                auVar111 = vfmadd213ps_fma(auVar165,auVar97,ZEXT1632(auVar140));
                auVar58 = vpcmpeqd_avx(auVar97._0_16_,auVar97._0_16_);
                auVar256 = ZEXT1664(auVar58);
                uVar42 = uVar42 + 8;
              } while ((uVar41 + 8 & 0xfffffffffffffff8) != uVar42);
              auVar59 = vorps_avx(auVar172,auVar80);
              auVar249._0_4_ = uVar36 ^ auVar67._0_4_;
              auVar249._4_4_ = uVar48 ^ auVar67._4_4_;
              auVar249._8_4_ = uVar47 ^ auVar67._8_4_;
              auVar249._12_4_ = uVar24 ^ auVar67._12_4_;
              auVar59 = vpcmpgtq_avx(auVar249,auVar59);
              auVar59 = vpackssdw_avx(auVar59,auVar124);
              auVar172 = vorps_avx(auVar172,auVar80);
              auVar239._0_4_ = uVar36 ^ auVar99._0_4_;
              auVar239._4_4_ = uVar48 ^ auVar99._4_4_;
              auVar239._8_4_ = uVar47 ^ auVar99._8_4_;
              auVar239._12_4_ = uVar24 ^ auVar99._12_4_;
              auVar172 = vpcmpgtq_avx(auVar239,auVar172);
              auVar172 = vpackssdw_avx(auVar172,auVar89);
              auVar111 = vblendvps_avx(auVar140,auVar111,auVar58 ^ auVar172);
              auVar172 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar58 ^ auVar59
                                      );
              auVar111 = vhaddps_avx(auVar172,auVar111);
              auVar111 = vhaddps_avx(auVar111,auVar111);
              auVar111 = vhaddps_avx(auVar111,auVar111);
            }
            auVar64._0_4_ = auVar250._0_4_ + auVar250._16_4_ + auVar168._0_4_;
            auVar64._4_4_ = auVar250._4_4_ + auVar250._20_4_ + auVar168._4_4_;
            auVar64._8_4_ = auVar250._8_4_ + auVar250._24_4_ + auVar168._8_4_;
            auVar64._12_4_ = auVar250._12_4_ + auVar250._28_4_ + auVar168._12_4_;
            auVar168 = vhaddps_avx(auVar64,auVar64);
            auVar168 = vhaddps_avx(auVar168,auVar168);
            fVar109 = auVar168._0_4_ + auVar111._0_4_;
            auVar111 = ZEXT416((uint)fVar109);
            auVar168 = auVar256._0_16_;
            fVar71 = fVar109;
            switch(uVar33) {
            case 1:
              auVar111 = vmaxss_avx(auVar111,ZEXT416(0));
              fVar71 = auVar111._0_4_;
              break;
            case 2:
              auVar111 = vcmpss_avx(ZEXT816(0) << 0x20,auVar111,1);
              auVar143._8_4_ = 0x3f800000;
              auVar143._0_8_ = 0x3f8000003f800000;
              auVar143._12_4_ = 0x3f800000;
              auVar111 = vblendvps_avx(ZEXT416((uint)*pfVar23),auVar143,auVar111);
              fVar71 = auVar111._0_4_ * fVar109;
              break;
            case 3:
              auVar111 = vmaxss_avx(auVar111,ZEXT416((uint)*pfVar23));
              fVar71 = auVar111._0_4_;
              if (pfVar23[1] < auVar111._0_4_) {
                fVar71 = pfVar23[1];
              }
              break;
            case 4:
              auVar111 = vminss_avx(auVar111,ZEXT416(0x42b0c0a5));
              auVar90._0_8_ = auVar111._0_8_ ^ 0x8000000080000000;
              auVar90._8_4_ = auVar111._8_4_ ^ 0x80000000;
              auVar90._12_4_ = auVar111._12_4_ ^ 0x80000000;
              auVar111 = vcmpss_avx(auVar111,ZEXT416(0xc2b0c0a5),1);
              auVar142._8_4_ = 0x42b0c0a5;
              auVar142._0_8_ = 0x42b0c0a542b0c0a5;
              auVar142._12_4_ = 0x42b0c0a5;
              auVar111 = vblendvps_avx(auVar90,auVar142,auVar111);
              fVar109 = expf(auVar111._0_4_);
              auVar111 = vpcmpeqd_avx(auVar168,auVar168);
              auVar256 = ZEXT1664(auVar111);
              auVar201 = ZEXT1664(local_e8);
              auVar166 = ZEXT3264(_DAT_00594fe0);
              auVar107 = ZEXT3264(_DAT_00594fc0);
              fVar71 = 1.0 / (fVar109 + 1.0);
              break;
            case 5:
              fVar71 = expf(fVar109);
              fVar71 = logf(fVar71 + 1.0);
              fVar71 = tanhf(fVar71);
              auVar111 = vpcmpeqd_avx(auVar168,auVar168);
              auVar256 = ZEXT1664(auVar111);
              auVar201 = ZEXT1664(local_e8);
              auVar166 = ZEXT3264(_DAT_00594fe0);
              auVar107 = ZEXT3264(_DAT_00594fc0);
              fVar71 = fVar71 * fVar109;
              break;
            case 6:
              fVar310 = *pfVar23;
              fVar167 = -pfVar23[1] / fVar310;
              fVar71 = 0.0;
              if ((fVar167 <= fVar109) && (fVar71 = fVar109, fVar109 <= fVar167 + 1.0 / fVar310)) {
                auVar111 = vfmadd213ss_fma(ZEXT416((uint)fVar310),auVar111,ZEXT416((uint)pfVar23[1])
                                          );
                fVar71 = auVar111._0_4_ * fVar109;
              }
            }
            *(float *)((long)pvVar22 + uVar34 * 4) = fVar71;
            uVar34 = uVar34 + 1;
          } while (uVar34 != local_c8);
          local_164 = 0;
        }
      }
      else if (iVar31 == 4) {
        if (0 < (int)uVar36) {
          uVar34 = 0;
          auVar233._8_4_ = 0x3f000000;
          auVar233._0_8_ = 0x3f0000003f000000;
          auVar233._12_4_ = 0x3f000000;
          auVar256 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
          auVar358._8_4_ = 0x3ab743ce;
          auVar358._0_8_ = 0x3ab743ce3ab743ce;
          auVar358._12_4_ = 0x3ab743ce;
          auVar312._8_4_ = 0x3c088908;
          auVar312._0_8_ = 0x3c0889083c088908;
          auVar312._12_4_ = 0x3c088908;
          auVar257._8_4_ = 0x3d2aa9c1;
          auVar257._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar257._12_4_ = 0x3d2aa9c1;
          do {
            auVar111 = ZEXT816(0) << 0x40;
            if (lVar21 != 0) {
              auVar111 = *(undefined1 (*) [16])(lVar21 + uVar34 * 0x10);
            }
            pauVar43 = (undefined1 (*) [32])
                       ((long)(this->weight_data_tm).w * uVar34 * (this->weight_data_tm).elemsize +
                       (long)(this->weight_data_tm).data);
            pauVar32 = local_138;
            if ((int)uVar51 < 8) {
              auVar99 = SUB6432(ZEXT864(0),0);
              auVar250 = SUB6432(ZEXT864(0),0);
              auVar166 = ZEXT864(0);
              auVar107 = ZEXT864(0);
              uVar48 = 0;
            }
            else {
              auVar107 = ZEXT864(0);
              iVar31 = 7;
              auVar166 = ZEXT864(0);
              auVar201 = ZEXT864(0);
              auVar377 = ZEXT864(0);
              do {
                uVar8 = *(undefined4 *)*pauVar32;
                auVar227._4_4_ = uVar8;
                auVar227._0_4_ = uVar8;
                auVar227._8_4_ = uVar8;
                auVar227._12_4_ = uVar8;
                uVar8 = *(undefined4 *)(*pauVar32 + 4);
                auVar227._20_4_ = uVar8;
                auVar227._16_4_ = uVar8;
                auVar227._24_4_ = uVar8;
                auVar227._28_4_ = uVar8;
                uVar8 = *(undefined4 *)(*pauVar32 + 8);
                auVar297._4_4_ = uVar8;
                auVar297._0_4_ = uVar8;
                auVar297._8_4_ = uVar8;
                auVar297._12_4_ = uVar8;
                uVar8 = *(undefined4 *)(*pauVar32 + 0xc);
                auVar297._20_4_ = uVar8;
                auVar297._16_4_ = uVar8;
                auVar297._24_4_ = uVar8;
                auVar297._28_4_ = uVar8;
                uVar8 = *(undefined4 *)(*pauVar32 + 0x10);
                auVar341._4_4_ = uVar8;
                auVar341._0_4_ = uVar8;
                auVar341._8_4_ = uVar8;
                auVar341._12_4_ = uVar8;
                uVar8 = *(undefined4 *)(*pauVar32 + 0x14);
                auVar341._20_4_ = uVar8;
                auVar341._16_4_ = uVar8;
                auVar341._24_4_ = uVar8;
                auVar341._28_4_ = uVar8;
                uVar8 = *(undefined4 *)(*pauVar32 + 0x18);
                auVar349._4_4_ = uVar8;
                auVar349._0_4_ = uVar8;
                auVar349._8_4_ = uVar8;
                auVar349._12_4_ = uVar8;
                uVar8 = *(undefined4 *)(*pauVar32 + 0x1c);
                auVar349._20_4_ = uVar8;
                auVar349._16_4_ = uVar8;
                auVar349._24_4_ = uVar8;
                auVar349._28_4_ = uVar8;
                auVar168 = vfmadd231ps_fma(auVar107._0_32_,auVar227,*pauVar43);
                auVar107 = ZEXT1664(auVar168);
                auVar168 = vfmadd231ps_fma(auVar166._0_32_,auVar297,pauVar43[1]);
                auVar166 = ZEXT1664(auVar168);
                auVar168 = vfmadd231ps_fma(auVar201._0_32_,auVar341,pauVar43[2]);
                auVar201 = ZEXT1664(auVar168);
                auVar250 = ZEXT1632(auVar168);
                auVar168 = vfmadd231ps_fma(auVar377._0_32_,auVar349,pauVar43[3]);
                auVar377 = ZEXT1664(auVar168);
                auVar99 = ZEXT1632(auVar168);
                pauVar32 = pauVar32 + 1;
                pauVar43 = pauVar43 + 4;
                iVar31 = iVar31 + 8;
                uVar48 = uVar51 & 0xfffffff8;
              } while (iVar31 < (int)uVar51);
            }
            auVar97 = auVar107._0_32_;
            auVar67 = auVar166._0_32_;
            uVar47 = uVar48 | 3;
            while ((int)uVar47 < (int)uVar51) {
              uVar8 = *(undefined4 *)*pauVar32;
              auVar228._4_4_ = uVar8;
              auVar228._0_4_ = uVar8;
              auVar228._8_4_ = uVar8;
              auVar228._12_4_ = uVar8;
              uVar8 = *(undefined4 *)(*pauVar32 + 4);
              auVar228._20_4_ = uVar8;
              auVar228._16_4_ = uVar8;
              auVar228._24_4_ = uVar8;
              auVar228._28_4_ = uVar8;
              uVar8 = *(undefined4 *)(*pauVar32 + 8);
              auVar298._4_4_ = uVar8;
              auVar298._0_4_ = uVar8;
              auVar298._8_4_ = uVar8;
              auVar298._12_4_ = uVar8;
              uVar8 = *(undefined4 *)(*pauVar32 + 0xc);
              auVar298._20_4_ = uVar8;
              auVar298._16_4_ = uVar8;
              auVar298._24_4_ = uVar8;
              auVar298._28_4_ = uVar8;
              auVar168 = vfmadd231ps_fma(auVar107._0_32_,auVar228,*pauVar43);
              auVar107 = ZEXT1664(auVar168);
              auVar97 = ZEXT1632(auVar168);
              auVar168 = vfmadd231ps_fma(auVar166._0_32_,auVar298,pauVar43[1]);
              auVar166 = ZEXT1664(auVar168);
              auVar67 = ZEXT1632(auVar168);
              pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
              pauVar43 = pauVar43 + 2;
              uVar47 = uVar48 + 7;
              uVar48 = uVar48 + 4;
            }
            if (uVar51 - uVar48 != 0 && (int)uVar48 <= (int)uVar51) {
              lVar45 = 0;
              do {
                uVar8 = *(undefined4 *)(*pauVar32 + lVar45 * 4);
                auVar203._4_4_ = uVar8;
                auVar203._0_4_ = uVar8;
                auVar203._8_4_ = uVar8;
                auVar203._12_4_ = uVar8;
                auVar111 = vfmadd231ps_fma(auVar111,auVar203,*(undefined1 (*) [16])*pauVar43);
                pauVar43 = (undefined1 (*) [32])(*pauVar43 + 0x10);
                lVar45 = lVar45 + 1;
              } while (uVar51 - uVar48 != (int)lVar45);
            }
            fVar109 = auVar99._4_4_ + auVar250._4_4_ + auVar67._4_4_ + auVar97._4_4_;
            auVar369._0_4_ =
                 auVar111._0_4_ +
                 auVar99._16_4_ + auVar250._16_4_ + auVar67._16_4_ + auVar97._16_4_ +
                 auVar99._0_4_ + auVar250._0_4_ + auVar67._0_4_ + auVar97._0_4_;
            auVar369._4_4_ = auVar111._4_4_ + fVar109 + fVar109;
            auVar369._8_4_ =
                 auVar111._8_4_ +
                 auVar99._24_4_ + auVar250._24_4_ + auVar67._24_4_ + auVar97._24_4_ +
                 auVar99._8_4_ + auVar250._8_4_ + auVar67._8_4_ + auVar97._8_4_;
            auVar369._12_4_ =
                 auVar111._12_4_ +
                 auVar99._28_4_ + auVar250._28_4_ + auVar67._28_4_ + auVar97._28_4_ +
                 auVar99._12_4_ + auVar250._12_4_ + auVar67._12_4_ + auVar97._12_4_;
            auVar111 = auVar256._0_16_;
            fVar109 = auVar256._0_4_;
            fVar71 = auVar256._4_4_;
            fVar310 = auVar256._8_4_;
            fVar167 = auVar256._12_4_;
            switch(uVar33) {
            case 1:
              auVar369 = vmaxps_avx(auVar369,_DAT_00592020);
              break;
            case 2:
              auVar111 = vmaxps_avx(auVar369,ZEXT816(0) << 0x40);
              auVar168 = vminps_avx(auVar369,ZEXT816(0) << 0x40);
              uVar8 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
              auVar370._4_4_ = uVar8;
              auVar370._0_4_ = uVar8;
              auVar370._8_4_ = uVar8;
              auVar370._12_4_ = uVar8;
              auVar369 = vfmadd213ps_fma(auVar370,auVar168,auVar111);
              break;
            case 3:
              uVar8 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
              auVar76._4_4_ = uVar8;
              auVar76._0_4_ = uVar8;
              auVar76._8_4_ = uVar8;
              auVar76._12_4_ = uVar8;
              uVar8 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var19))[1];
              auVar118._4_4_ = uVar8;
              auVar118._0_4_ = uVar8;
              auVar118._8_4_ = uVar8;
              auVar118._12_4_ = uVar8;
              auVar111 = vmaxps_avx(auVar369,auVar76);
              auVar369 = vminps_avx(auVar111,auVar118);
              break;
            case 4:
              uVar41 = CONCAT44(auVar369._4_4_,auVar369._0_4_);
              auVar77._0_8_ = uVar41 ^ 0x8000000080000000;
              auVar77._8_4_ = -auVar369._8_4_;
              auVar77._12_4_ = -auVar369._12_4_;
              auVar119._8_4_ = 0x42b0c0a5;
              auVar119._0_8_ = 0x42b0c0a542b0c0a5;
              auVar119._12_4_ = 0x42b0c0a5;
              auVar168 = vminps_avx(auVar77,auVar119);
              auVar120._8_4_ = 0xc2b0c0a5;
              auVar120._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar120._12_4_ = 0xc2b0c0a5;
              auVar59 = vmaxps_avx(auVar168,auVar120);
              auVar121._8_4_ = 0x3fb8aa3b;
              auVar121._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar121._12_4_ = 0x3fb8aa3b;
              auVar168 = vfmadd213ps_fma(auVar121,auVar59,auVar233);
              auVar177._0_4_ = (int)auVar168._0_4_;
              auVar177._4_4_ = (int)auVar168._4_4_;
              auVar177._8_4_ = (int)auVar168._8_4_;
              auVar177._12_4_ = (int)auVar168._12_4_;
              auVar172 = vcvtdq2ps_avx(auVar177);
              auVar168 = vcmpps_avx(auVar168,auVar172,1);
              auVar168 = vandps_avx(auVar168,auVar111);
              auVar168 = vsubps_avx(auVar172,auVar168);
              auVar55._8_4_ = 0x3f318000;
              auVar55._0_8_ = 0x3f3180003f318000;
              auVar55._12_4_ = 0x3f318000;
              auVar172 = vfmsub231ps_fma(auVar59,auVar168,auVar55);
              auVar178._8_4_ = 0x395e8083;
              auVar178._0_8_ = 0x395e8083395e8083;
              auVar178._12_4_ = 0x395e8083;
              auVar59 = vfmsub231ps_fma(auVar172,auVar168,auVar178);
              auVar179._0_4_ = auVar59._0_4_ * auVar59._0_4_;
              auVar179._4_4_ = auVar59._4_4_ * auVar59._4_4_;
              auVar179._8_4_ = auVar59._8_4_ * auVar59._8_4_;
              auVar179._12_4_ = auVar59._12_4_ * auVar59._12_4_;
              auVar210._8_4_ = 0x39506967;
              auVar210._0_8_ = 0x3950696739506967;
              auVar210._12_4_ = 0x39506967;
              auVar273._8_4_ = 0x3ab743ce;
              auVar273._0_8_ = 0x3ab743ce3ab743ce;
              auVar273._12_4_ = 0x3ab743ce;
              auVar172 = vfmadd213ps_fma(auVar210,auVar59,auVar273);
              auVar274._8_4_ = 0x3c088908;
              auVar274._0_8_ = 0x3c0889083c088908;
              auVar274._12_4_ = 0x3c088908;
              auVar172 = vfmadd213ps_fma(auVar172,auVar59,auVar274);
              auVar56._8_4_ = 0x3d2aa9c1;
              auVar56._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar56._12_4_ = 0x3d2aa9c1;
              auVar172 = vfmadd213ps_fma(auVar172,auVar59,auVar56);
              auVar57._8_4_ = 0x3e2aaaaa;
              auVar57._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar57._12_4_ = 0x3e2aaaaa;
              auVar172 = vfmadd213ps_fma(auVar172,auVar59,auVar57);
              auVar172 = vfmadd213ps_fma(auVar172,auVar59,auVar233);
              auVar172 = vfmadd213ps_fma(auVar172,auVar179,auVar59);
              auVar78._0_4_ = auVar172._0_4_ + fVar109;
              auVar78._4_4_ = auVar172._4_4_ + fVar71;
              auVar78._8_4_ = auVar172._8_4_ + fVar310;
              auVar78._12_4_ = auVar172._12_4_ + fVar167;
              auVar122._0_4_ = (int)auVar168._0_4_;
              auVar122._4_4_ = (int)auVar168._4_4_;
              auVar122._8_4_ = (int)auVar168._8_4_;
              auVar122._12_4_ = (int)auVar168._12_4_;
              auVar168 = vpslld_avx(auVar122,0x17);
              auVar168 = vpaddd_avx(auVar168,auVar111);
              auVar172 = vfmadd213ps_fma(auVar168,auVar78,auVar111);
              auVar168 = vrcpps_avx(auVar172);
              auVar111 = vfmsub213ps_fma(auVar172,auVar168,auVar111);
              auVar369 = vfnmadd132ps_fma(auVar111,auVar168,auVar168);
              break;
            case 5:
              auVar334._8_4_ = 0x42b0c0a5;
              auVar334._0_8_ = 0x42b0c0a542b0c0a5;
              auVar334._12_4_ = 0x42b0c0a5;
              auVar168 = vminps_avx(auVar369,auVar334);
              auVar346._8_4_ = 0xc2b0c0a5;
              auVar346._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar346._12_4_ = 0xc2b0c0a5;
              auVar59 = vmaxps_avx(auVar346,auVar168);
              auVar352._8_4_ = 0x3fb8aa3b;
              auVar352._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar352._12_4_ = 0x3fb8aa3b;
              auVar168 = vfmadd213ps_fma(auVar352,auVar59,auVar233);
              auVar169._0_4_ = (int)auVar168._0_4_;
              auVar169._4_4_ = (int)auVar168._4_4_;
              auVar169._8_4_ = (int)auVar168._8_4_;
              auVar169._12_4_ = (int)auVar168._12_4_;
              auVar172 = vcvtdq2ps_avx(auVar169);
              auVar168 = vcmpps_avx(auVar168,auVar172,1);
              auVar168 = vandps_avx(auVar168,auVar111);
              auVar168 = vsubps_avx(auVar172,auVar168);
              auVar335._8_4_ = 0x3f318000;
              auVar335._0_8_ = 0x3f3180003f318000;
              auVar335._12_4_ = 0x3f318000;
              auVar172 = vfmsub231ps_fma(auVar59,auVar168,auVar335);
              auVar245._8_4_ = 0xb95e8083;
              auVar245._0_8_ = 0xb95e8083b95e8083;
              auVar245._12_4_ = 0xb95e8083;
              auVar59 = vfnmsub231ps_fma(auVar172,auVar168,auVar245);
              auVar170._0_4_ = auVar59._0_4_ * auVar59._0_4_;
              auVar170._4_4_ = auVar59._4_4_ * auVar59._4_4_;
              auVar170._8_4_ = auVar59._8_4_ * auVar59._8_4_;
              auVar170._12_4_ = auVar59._12_4_ * auVar59._12_4_;
              auVar204._8_4_ = 0x39506967;
              auVar204._0_8_ = 0x3950696739506967;
              auVar204._12_4_ = 0x39506967;
              auVar172 = vfmadd213ps_fma(auVar204,auVar59,auVar358);
              auVar172 = vfmadd213ps_fma(auVar172,auVar59,auVar312);
              auVar172 = vfmadd213ps_fma(auVar172,auVar59,auVar257);
              auVar270._8_4_ = 0x3e2aaaaa;
              auVar270._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar270._12_4_ = 0x3e2aaaaa;
              auVar172 = vfmadd213ps_fma(auVar172,auVar59,auVar270);
              auVar172 = vfmadd213ps_fma(auVar172,auVar59,auVar233);
              auVar172 = vfmadd213ps_fma(auVar172,auVar170,auVar59);
              auVar171._0_4_ = auVar172._0_4_ + fVar109;
              auVar171._4_4_ = auVar172._4_4_ + fVar71;
              auVar171._8_4_ = auVar172._8_4_ + fVar310;
              auVar171._12_4_ = auVar172._12_4_ + fVar167;
              auVar74._0_4_ = (int)auVar168._0_4_;
              auVar74._4_4_ = (int)auVar168._4_4_;
              auVar74._8_4_ = (int)auVar168._8_4_;
              auVar74._12_4_ = (int)auVar168._12_4_;
              auVar168 = vpslld_avx(auVar74,0x17);
              auVar168 = vpaddd_avx(auVar168,auVar111);
              auVar80 = vfmadd213ps_fma(auVar168,auVar171,auVar111);
              auVar113._8_4_ = 0x800000;
              auVar113._0_8_ = 0x80000000800000;
              auVar113._12_4_ = 0x800000;
              auVar168 = vmaxps_avx(auVar80,auVar113);
              auVar172 = vpsrld_avx(auVar168,0x17);
              auVar205._8_4_ = 0xffffff82;
              auVar205._0_8_ = 0xffffff82ffffff82;
              auVar205._12_4_ = 0xffffff82;
              auVar172 = vpaddd_avx(auVar172,auVar205);
              auVar206._8_4_ = 0x807fffff;
              auVar206._0_8_ = 0x807fffff807fffff;
              auVar206._12_4_ = 0x807fffff;
              auVar168 = vandps_avx(auVar168,auVar206);
              auVar360 = vorps_avx(auVar168,auVar233);
              auVar59 = vcvtdq2ps_avx(auVar172);
              auVar207._8_4_ = 0x3f3504f3;
              auVar207._0_8_ = 0x3f3504f33f3504f3;
              auVar207._12_4_ = 0x3f3504f3;
              auVar172 = vcmpps_avx(auVar360,auVar207,1);
              auVar168 = vandps_avx(auVar172,auVar360);
              auVar114._0_4_ = auVar168._0_4_ + auVar360._0_4_ + -1.0;
              auVar114._4_4_ = auVar168._4_4_ + auVar360._4_4_ + -1.0;
              auVar114._8_4_ = auVar168._8_4_ + auVar360._8_4_ + -1.0;
              auVar114._12_4_ = auVar168._12_4_ + auVar360._12_4_ + -1.0;
              auVar168 = vandps_avx(auVar172,auVar111);
              auVar172 = vsubps_avx(auVar59,auVar168);
              auVar208._0_4_ = auVar114._0_4_ * auVar114._0_4_;
              auVar208._4_4_ = auVar114._4_4_ * auVar114._4_4_;
              auVar208._8_4_ = auVar114._8_4_ * auVar114._8_4_;
              auVar208._12_4_ = auVar114._12_4_ * auVar114._12_4_;
              auVar271._8_4_ = 0x3d9021bb;
              auVar271._0_8_ = 0x3d9021bb3d9021bb;
              auVar271._12_4_ = 0x3d9021bb;
              auVar284._8_4_ = 0xbdebd1b8;
              auVar284._0_8_ = 0xbdebd1b8bdebd1b8;
              auVar284._12_4_ = 0xbdebd1b8;
              auVar168 = vfmadd213ps_fma(auVar271,auVar114,auVar284);
              auVar285._8_4_ = 0x3def251a;
              auVar285._0_8_ = 0x3def251a3def251a;
              auVar285._12_4_ = 0x3def251a;
              auVar168 = vfmadd213ps_fma(auVar168,auVar114,auVar285);
              auVar286._8_4_ = 0xbdfe5d4f;
              auVar286._0_8_ = 0xbdfe5d4fbdfe5d4f;
              auVar286._12_4_ = 0xbdfe5d4f;
              auVar168 = vfmadd213ps_fma(auVar168,auVar114,auVar286);
              auVar287._8_4_ = 0x3e11e9bf;
              auVar287._0_8_ = 0x3e11e9bf3e11e9bf;
              auVar287._12_4_ = 0x3e11e9bf;
              auVar168 = vfmadd213ps_fma(auVar168,auVar114,auVar287);
              auVar288._8_4_ = 0xbe2aae50;
              auVar288._0_8_ = 0xbe2aae50be2aae50;
              auVar288._12_4_ = 0xbe2aae50;
              auVar168 = vfmadd213ps_fma(auVar168,auVar114,auVar288);
              auVar289._8_4_ = 0x3e4cceac;
              auVar289._0_8_ = 0x3e4cceac3e4cceac;
              auVar289._12_4_ = 0x3e4cceac;
              auVar168 = vfmadd213ps_fma(auVar168,auVar114,auVar289);
              auVar290._8_4_ = 0xbe7ffffc;
              auVar290._0_8_ = 0xbe7ffffcbe7ffffc;
              auVar290._12_4_ = 0xbe7ffffc;
              auVar168 = vfmadd213ps_fma(auVar168,auVar114,auVar290);
              auVar291._8_4_ = 0x3eaaaaaa;
              auVar291._0_8_ = 0x3eaaaaaa3eaaaaaa;
              auVar291._12_4_ = 0x3eaaaaaa;
              auVar168 = vfmadd213ps_fma(auVar168,auVar114,auVar291);
              auVar272._0_4_ = auVar208._0_4_ * auVar114._0_4_ * auVar168._0_4_;
              auVar272._4_4_ = auVar208._4_4_ * auVar114._4_4_ * auVar168._4_4_;
              auVar272._8_4_ = auVar208._8_4_ * auVar114._8_4_ * auVar168._8_4_;
              auVar272._12_4_ = auVar208._12_4_ * auVar114._12_4_ * auVar168._12_4_;
              auVar168 = vfmadd231ps_fma(auVar272,auVar172,auVar245);
              auVar59 = vfmsub231ps_fma(auVar168,auVar233,auVar208);
              auVar168 = vcmpps_avx(auVar80,_DAT_00592020,2);
              auVar59 = vsubps_avx(auVar59,auVar114);
              auVar172 = vfnmadd231ps_fma(auVar59,auVar335,auVar172);
              auVar115._0_4_ = auVar172._0_4_ + auVar172._0_4_;
              auVar115._4_4_ = auVar172._4_4_ + auVar172._4_4_;
              auVar115._8_4_ = auVar172._8_4_ + auVar172._8_4_;
              auVar115._12_4_ = auVar172._12_4_ + auVar172._12_4_;
              auVar173._8_4_ = 0x7fffffff;
              auVar173._0_8_ = 0x7fffffff7fffffff;
              auVar173._12_4_ = 0x7fffffff;
              auVar168 = vblendvps_avx(auVar115,auVar173,auVar168);
              auVar116._8_4_ = 0x42b0c0a5;
              auVar116._0_8_ = 0x42b0c0a542b0c0a5;
              auVar116._12_4_ = 0x42b0c0a5;
              auVar168 = vminps_avx(auVar168,auVar116);
              auVar59 = vmaxps_avx(auVar346,auVar168);
              auVar168 = vfmadd213ps_fma(auVar352,auVar59,auVar233);
              auVar174._0_4_ = (int)auVar168._0_4_;
              auVar174._4_4_ = (int)auVar168._4_4_;
              auVar174._8_4_ = (int)auVar168._8_4_;
              auVar174._12_4_ = (int)auVar168._12_4_;
              auVar172 = vcvtdq2ps_avx(auVar174);
              auVar168 = vcmpps_avx(auVar168,auVar172,1);
              auVar168 = vandps_avx(auVar168,auVar111);
              auVar168 = vsubps_avx(auVar172,auVar168);
              auVar172 = vfmsub231ps_fma(auVar59,auVar168,auVar335);
              auVar59 = vfnmsub231ps_fma(auVar172,auVar168,auVar245);
              auVar256 = ZEXT1664(auVar111);
              auVar175._0_4_ = auVar59._0_4_ * auVar59._0_4_;
              auVar175._4_4_ = auVar59._4_4_ * auVar59._4_4_;
              auVar175._8_4_ = auVar59._8_4_ * auVar59._8_4_;
              auVar175._12_4_ = auVar59._12_4_ * auVar59._12_4_;
              auVar209._8_4_ = 0x39506967;
              auVar209._0_8_ = 0x3950696739506967;
              auVar209._12_4_ = 0x39506967;
              auVar172 = vfmadd213ps_fma(auVar209,auVar59,auVar358);
              auVar172 = vfmadd213ps_fma(auVar172,auVar59,auVar312);
              auVar172 = vfmadd213ps_fma(auVar172,auVar59,auVar257);
              auVar53._8_4_ = 0x3e2aaaaa;
              auVar53._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar53._12_4_ = 0x3e2aaaaa;
              auVar172 = vfmadd213ps_fma(auVar172,auVar59,auVar53);
              auVar172 = vfmadd213ps_fma(auVar172,auVar59,auVar233);
              auVar172 = vfmadd213ps_fma(auVar172,auVar175,auVar59);
              auVar75._0_4_ = auVar172._0_4_ + fVar109;
              auVar75._4_4_ = auVar172._4_4_ + fVar71;
              auVar75._8_4_ = auVar172._8_4_ + fVar310;
              auVar75._12_4_ = auVar172._12_4_ + fVar167;
              auVar117._0_4_ = (int)auVar168._0_4_;
              auVar117._4_4_ = (int)auVar168._4_4_;
              auVar117._8_4_ = (int)auVar168._8_4_;
              auVar117._12_4_ = (int)auVar168._12_4_;
              auVar168 = vpslld_avx(auVar117,0x17);
              auVar168 = vpaddd_avx(auVar168,auVar111);
              auVar168 = vfmadd213ps_fma(auVar168,auVar75,auVar111);
              auVar111 = vrcpps_avx(auVar168);
              auVar176._0_4_ = auVar111._0_4_ + auVar111._0_4_;
              auVar176._4_4_ = auVar111._4_4_ + auVar111._4_4_;
              auVar176._8_4_ = auVar111._8_4_ + auVar111._8_4_;
              auVar176._12_4_ = auVar111._12_4_ + auVar111._12_4_;
              auVar54._8_4_ = 0x40000000;
              auVar54._0_8_ = 0x4000000040000000;
              auVar54._12_4_ = 0x40000000;
              auVar168 = vfmsub213ps_fma(auVar168,auVar176,auVar54);
              auVar111 = vfnmadd213ps_fma(auVar168,auVar111,auVar176);
              auVar369 = vfmsub231ps_fma(auVar369,auVar369,auVar111);
              break;
            case 6:
              uVar8 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
              auVar79._4_4_ = uVar8;
              auVar79._0_4_ = uVar8;
              auVar79._8_4_ = uVar8;
              auVar79._12_4_ = uVar8;
              uVar8 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var19))[1];
              auVar123._4_4_ = uVar8;
              auVar123._0_4_ = uVar8;
              auVar123._8_4_ = uVar8;
              auVar123._12_4_ = uVar8;
              auVar168 = vfmadd231ps_fma(auVar123,auVar369,auVar79);
              auVar168 = vmaxps_avx(auVar168,_DAT_00592020);
              auVar111 = vminps_avx(auVar168,auVar111);
              auVar369._0_4_ = auVar369._0_4_ * auVar111._0_4_;
              auVar369._4_4_ = auVar369._4_4_ * auVar111._4_4_;
              auVar369._8_4_ = auVar369._8_4_ * auVar111._8_4_;
              auVar369._12_4_ = auVar369._12_4_ * auVar111._12_4_;
            }
            *(undefined1 (*) [16])((long)top_blob->data + uVar34 * 0x10) = auVar369;
            uVar34 = uVar34 + 1;
          } while (uVar34 != uVar36);
        }
      }
      else if ((iVar31 == 8) && (0 < (int)uVar36)) {
        uVar34 = 0;
        auVar277._8_4_ = 0x3f000000;
        auVar277._0_8_ = 0x3f0000003f000000;
        auVar277._12_4_ = 0x3f000000;
        auVar277._16_4_ = 0x3f000000;
        auVar277._20_4_ = 0x3f000000;
        auVar277._24_4_ = 0x3f000000;
        auVar277._28_4_ = 0x3f000000;
        auVar256 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        do {
          auVar107 = ZEXT1664(ZEXT816(0) << 0x40);
          if (lVar21 != 0) {
            auVar107 = ZEXT3264(*(undefined1 (*) [32])(lVar21 + uVar34 * 0x20));
          }
          pauVar43 = (undefined1 (*) [32])
                     ((long)(this->weight_data_tm).w * uVar34 * (this->weight_data_tm).elemsize +
                     (long)(this->weight_data_tm).data);
          pauVar32 = local_138;
          if ((int)uVar51 < 8) {
            auVar99 = SUB6432(ZEXT864(0),0);
            auVar97 = SUB6432(ZEXT864(0),0);
            auVar250 = SUB6432(ZEXT864(0),0);
            auVar67 = SUB6432(ZEXT864(0),0);
            auVar166 = ZEXT864(0);
            auVar201 = ZEXT864(0);
            auVar377 = ZEXT864(0);
            uVar48 = 0;
          }
          else {
            auVar377 = ZEXT864(0);
            iVar31 = 7;
            auVar201 = ZEXT864(0);
            auVar166 = ZEXT864(0);
            auVar345 = ZEXT864(0);
            auVar244 = ZEXT864(0);
            auVar351 = ZEXT864(0);
            auVar309 = ZEXT864(0);
            do {
              uVar8 = *(undefined4 *)*pauVar32;
              auVar353._4_4_ = uVar8;
              auVar353._0_4_ = uVar8;
              auVar353._8_4_ = uVar8;
              auVar353._12_4_ = uVar8;
              auVar353._16_4_ = uVar8;
              auVar353._20_4_ = uVar8;
              auVar353._24_4_ = uVar8;
              auVar353._28_4_ = uVar8;
              uVar8 = *(undefined4 *)(*pauVar32 + 4);
              auVar363._4_4_ = uVar8;
              auVar363._0_4_ = uVar8;
              auVar363._8_4_ = uVar8;
              auVar363._12_4_ = uVar8;
              auVar363._16_4_ = uVar8;
              auVar363._20_4_ = uVar8;
              auVar363._24_4_ = uVar8;
              auVar363._28_4_ = uVar8;
              uVar8 = *(undefined4 *)(*pauVar32 + 8);
              auVar316._4_4_ = uVar8;
              auVar316._0_4_ = uVar8;
              auVar316._8_4_ = uVar8;
              auVar316._12_4_ = uVar8;
              auVar316._16_4_ = uVar8;
              auVar316._20_4_ = uVar8;
              auVar316._24_4_ = uVar8;
              auVar316._28_4_ = uVar8;
              uVar8 = *(undefined4 *)(*pauVar32 + 0xc);
              auVar259._4_4_ = uVar8;
              auVar259._0_4_ = uVar8;
              auVar259._8_4_ = uVar8;
              auVar259._12_4_ = uVar8;
              auVar259._16_4_ = uVar8;
              auVar259._20_4_ = uVar8;
              auVar259._24_4_ = uVar8;
              auVar259._28_4_ = uVar8;
              auVar111 = vfmadd231ps_fma(auVar107._0_32_,auVar353,*pauVar43);
              auVar107 = ZEXT1664(auVar111);
              auVar111 = vfmadd231ps_fma(auVar377._0_32_,auVar363,pauVar43[1]);
              auVar377 = ZEXT1664(auVar111);
              auVar111 = vfmadd231ps_fma(auVar201._0_32_,auVar316,pauVar43[2]);
              auVar201 = ZEXT1664(auVar111);
              auVar111 = vfmadd231ps_fma(auVar166._0_32_,auVar259,pauVar43[3]);
              auVar166 = ZEXT1664(auVar111);
              uVar8 = *(undefined4 *)(*pauVar32 + 0x10);
              auVar260._4_4_ = uVar8;
              auVar260._0_4_ = uVar8;
              auVar260._8_4_ = uVar8;
              auVar260._12_4_ = uVar8;
              auVar260._16_4_ = uVar8;
              auVar260._20_4_ = uVar8;
              auVar260._24_4_ = uVar8;
              auVar260._28_4_ = uVar8;
              uVar8 = *(undefined4 *)(*pauVar32 + 0x14);
              auVar317._4_4_ = uVar8;
              auVar317._0_4_ = uVar8;
              auVar317._8_4_ = uVar8;
              auVar317._12_4_ = uVar8;
              auVar317._16_4_ = uVar8;
              auVar317._20_4_ = uVar8;
              auVar317._24_4_ = uVar8;
              auVar317._28_4_ = uVar8;
              uVar8 = *(undefined4 *)(*pauVar32 + 0x18);
              auVar354._4_4_ = uVar8;
              auVar354._0_4_ = uVar8;
              auVar354._8_4_ = uVar8;
              auVar354._12_4_ = uVar8;
              auVar354._16_4_ = uVar8;
              auVar354._20_4_ = uVar8;
              auVar354._24_4_ = uVar8;
              auVar354._28_4_ = uVar8;
              uVar8 = *(undefined4 *)(*pauVar32 + 0x1c);
              auVar364._4_4_ = uVar8;
              auVar364._0_4_ = uVar8;
              auVar364._8_4_ = uVar8;
              auVar364._12_4_ = uVar8;
              auVar364._16_4_ = uVar8;
              auVar364._20_4_ = uVar8;
              auVar364._24_4_ = uVar8;
              auVar364._28_4_ = uVar8;
              auVar111 = vfmadd231ps_fma(auVar345._0_32_,auVar260,pauVar43[4]);
              auVar345 = ZEXT1664(auVar111);
              auVar67 = ZEXT1632(auVar111);
              auVar111 = vfmadd231ps_fma(auVar244._0_32_,auVar317,pauVar43[5]);
              auVar244 = ZEXT1664(auVar111);
              auVar250 = ZEXT1632(auVar111);
              auVar111 = vfmadd231ps_fma(auVar351._0_32_,auVar354,pauVar43[6]);
              auVar351 = ZEXT1664(auVar111);
              auVar97 = ZEXT1632(auVar111);
              auVar111 = vfmadd231ps_fma(auVar309._0_32_,auVar364,pauVar43[7]);
              auVar309 = ZEXT1664(auVar111);
              auVar99 = ZEXT1632(auVar111);
              pauVar32 = pauVar32 + 1;
              pauVar43 = pauVar43 + 8;
              iVar31 = iVar31 + 8;
              uVar48 = uVar51 & 0xfffffff8;
            } while (iVar31 < (int)uVar51);
          }
          auVar252 = auVar201._0_32_;
          auVar367 = auVar377._0_32_;
          auVar165 = auVar166._0_32_;
          uVar47 = uVar48 | 3;
          while (auVar299 = auVar107._0_32_, (int)uVar47 < (int)uVar51) {
            uVar8 = *(undefined4 *)*pauVar32;
            auVar261._4_4_ = uVar8;
            auVar261._0_4_ = uVar8;
            auVar261._8_4_ = uVar8;
            auVar261._12_4_ = uVar8;
            auVar261._16_4_ = uVar8;
            auVar261._20_4_ = uVar8;
            auVar261._24_4_ = uVar8;
            auVar261._28_4_ = uVar8;
            uVar8 = *(undefined4 *)(*pauVar32 + 4);
            auVar318._4_4_ = uVar8;
            auVar318._0_4_ = uVar8;
            auVar318._8_4_ = uVar8;
            auVar318._12_4_ = uVar8;
            auVar318._16_4_ = uVar8;
            auVar318._20_4_ = uVar8;
            auVar318._24_4_ = uVar8;
            auVar318._28_4_ = uVar8;
            uVar8 = *(undefined4 *)(*pauVar32 + 8);
            auVar355._4_4_ = uVar8;
            auVar355._0_4_ = uVar8;
            auVar355._8_4_ = uVar8;
            auVar355._12_4_ = uVar8;
            auVar355._16_4_ = uVar8;
            auVar355._20_4_ = uVar8;
            auVar355._24_4_ = uVar8;
            auVar355._28_4_ = uVar8;
            uVar8 = *(undefined4 *)(*pauVar32 + 0xc);
            auVar365._4_4_ = uVar8;
            auVar365._0_4_ = uVar8;
            auVar365._8_4_ = uVar8;
            auVar365._12_4_ = uVar8;
            auVar365._16_4_ = uVar8;
            auVar365._20_4_ = uVar8;
            auVar365._24_4_ = uVar8;
            auVar365._28_4_ = uVar8;
            auVar111 = vfmadd231ps_fma(auVar299,auVar261,*pauVar43);
            auVar107 = ZEXT1664(auVar111);
            auVar111 = vfmadd231ps_fma(auVar377._0_32_,auVar318,pauVar43[1]);
            auVar377 = ZEXT1664(auVar111);
            auVar367 = ZEXT1632(auVar111);
            auVar111 = vfmadd231ps_fma(auVar201._0_32_,auVar355,pauVar43[2]);
            auVar201 = ZEXT1664(auVar111);
            auVar252 = ZEXT1632(auVar111);
            auVar111 = vfmadd231ps_fma(auVar166._0_32_,auVar365,pauVar43[3]);
            auVar166 = ZEXT1664(auVar111);
            auVar165 = ZEXT1632(auVar111);
            pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            pauVar43 = pauVar43 + 4;
            uVar47 = uVar48 + 7;
            uVar48 = uVar48 + 4;
          }
          if (uVar51 - uVar48 != 0 && (int)uVar48 <= (int)uVar51) {
            lVar45 = 0;
            do {
              uVar8 = *(undefined4 *)(*pauVar32 + lVar45 * 4);
              auVar262._4_4_ = uVar8;
              auVar262._0_4_ = uVar8;
              auVar262._8_4_ = uVar8;
              auVar262._12_4_ = uVar8;
              auVar262._16_4_ = uVar8;
              auVar262._20_4_ = uVar8;
              auVar262._24_4_ = uVar8;
              auVar262._28_4_ = uVar8;
              auVar111 = vfmadd231ps_fma(auVar107._0_32_,auVar262,*pauVar43);
              auVar107 = ZEXT1664(auVar111);
              auVar299 = ZEXT1632(auVar111);
              pauVar43 = pauVar43 + 1;
              lVar45 = lVar45 + 1;
            } while (uVar51 - uVar48 != (int)lVar45);
          }
          fVar72 = auVar97._0_4_ + auVar99._0_4_ + auVar67._0_4_ + auVar250._0_4_ +
                   auVar367._0_4_ + auVar165._0_4_ + auVar252._0_4_ + auVar299._0_4_;
          fVar108 = auVar97._4_4_ + auVar99._4_4_ + auVar67._4_4_ + auVar250._4_4_ +
                    auVar367._4_4_ + auVar165._4_4_ + auVar252._4_4_ + auVar299._4_4_;
          auVar92._0_8_ = CONCAT44(fVar108,fVar72);
          auVar92._8_4_ =
               auVar97._8_4_ + auVar99._8_4_ + auVar67._8_4_ + auVar250._8_4_ +
               auVar367._8_4_ + auVar165._8_4_ + auVar252._8_4_ + auVar299._8_4_;
          auVar92._12_4_ =
               auVar97._12_4_ + auVar99._12_4_ + auVar67._12_4_ + auVar250._12_4_ +
               auVar367._12_4_ + auVar165._12_4_ + auVar252._12_4_ + auVar299._12_4_;
          auVar92._16_4_ =
               auVar97._16_4_ + auVar99._16_4_ + auVar67._16_4_ + auVar250._16_4_ +
               auVar367._16_4_ + auVar165._16_4_ + auVar252._16_4_ + auVar299._16_4_;
          auVar92._20_4_ =
               auVar97._20_4_ + auVar99._20_4_ + auVar67._20_4_ + auVar250._20_4_ +
               auVar367._20_4_ + auVar165._20_4_ + auVar252._20_4_ + auVar299._20_4_;
          auVar92._24_4_ =
               auVar97._24_4_ + auVar99._24_4_ + auVar67._24_4_ + auVar250._24_4_ +
               auVar367._24_4_ + auVar165._24_4_ + auVar252._24_4_ + auVar299._24_4_;
          auVar92._28_4_ =
               auVar97._28_4_ + auVar99._28_4_ + auVar67._28_4_ + auVar250._28_4_ +
               auVar367._28_4_ + auVar165._28_4_ + auVar252._28_4_ + auVar299._28_4_;
          auVar250 = auVar256._0_32_;
          fVar109 = auVar256._0_4_;
          fVar71 = auVar256._4_4_;
          fVar310 = auVar256._8_4_;
          fVar167 = auVar256._12_4_;
          fVar330 = auVar256._16_4_;
          fVar331 = auVar256._20_4_;
          fVar332 = auVar256._24_4_;
          fVar333 = auVar256._28_4_;
          switch(uVar33) {
          case 1:
            auVar92 = vmaxps_avx(auVar92,_DAT_00597120);
            break;
          case 2:
            auVar250 = vmaxps_avx(auVar92,ZEXT1632(ZEXT816(0) << 0x40));
            auVar99 = vminps_avx(auVar92,ZEXT1632(ZEXT816(0) << 0x40));
            uVar8 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
            auVar96._4_4_ = uVar8;
            auVar96._0_4_ = uVar8;
            auVar96._8_4_ = uVar8;
            auVar96._12_4_ = uVar8;
            auVar96._16_4_ = uVar8;
            auVar96._20_4_ = uVar8;
            auVar96._24_4_ = uVar8;
            auVar96._28_4_ = uVar8;
            auVar111 = vfmadd213ps_fma(auVar96,auVar99,auVar250);
            auVar92 = ZEXT1632(auVar111);
            break;
          case 3:
            uVar8 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
            auVar148._4_4_ = uVar8;
            auVar148._0_4_ = uVar8;
            auVar148._8_4_ = uVar8;
            auVar148._12_4_ = uVar8;
            auVar148._16_4_ = uVar8;
            auVar148._20_4_ = uVar8;
            auVar148._24_4_ = uVar8;
            auVar148._28_4_ = uVar8;
            uVar8 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var19))[1];
            auVar193._4_4_ = uVar8;
            auVar193._0_4_ = uVar8;
            auVar193._8_4_ = uVar8;
            auVar193._12_4_ = uVar8;
            auVar193._16_4_ = uVar8;
            auVar193._20_4_ = uVar8;
            auVar193._24_4_ = uVar8;
            auVar193._28_4_ = uVar8;
            auVar250 = vmaxps_avx(auVar92,auVar148);
            auVar92 = vminps_avx(auVar250,auVar193);
            break;
          case 4:
            auVar93._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
            auVar93._8_4_ = -auVar92._8_4_;
            auVar93._12_4_ = -auVar92._12_4_;
            auVar93._16_4_ = -auVar92._16_4_;
            auVar93._20_4_ = -auVar92._20_4_;
            auVar93._24_4_ = -auVar92._24_4_;
            auVar93._28_4_ = -auVar92._28_4_;
            auVar149._8_4_ = 0x42b0c0a5;
            auVar149._0_8_ = 0x42b0c0a542b0c0a5;
            auVar149._12_4_ = 0x42b0c0a5;
            auVar149._16_4_ = 0x42b0c0a5;
            auVar149._20_4_ = 0x42b0c0a5;
            auVar149._24_4_ = 0x42b0c0a5;
            auVar149._28_4_ = 0x42b0c0a5;
            auVar99 = vminps_avx(auVar93,auVar149);
            auVar150._8_4_ = 0xc2b0c0a5;
            auVar150._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar150._12_4_ = 0xc2b0c0a5;
            auVar150._16_4_ = 0xc2b0c0a5;
            auVar150._20_4_ = 0xc2b0c0a5;
            auVar150._24_4_ = 0xc2b0c0a5;
            auVar150._28_4_ = 0xc2b0c0a5;
            auVar67 = vmaxps_avx(auVar99,auVar150);
            auVar151._8_4_ = 0x3fb8aa3b;
            auVar151._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar151._12_4_ = 0x3fb8aa3b;
            auVar151._16_4_ = 0x3fb8aa3b;
            auVar151._20_4_ = 0x3fb8aa3b;
            auVar151._24_4_ = 0x3fb8aa3b;
            auVar151._28_4_ = 0x3fb8aa3b;
            auVar111 = vfmadd213ps_fma(auVar151,auVar67,auVar277);
            auVar97 = vroundps_avx(ZEXT1632(auVar111),1);
            auVar99 = vcmpps_avx(ZEXT1632(auVar111),auVar97,1);
            auVar99 = vandps_avx(auVar99,auVar250);
            auVar99 = vsubps_avx(auVar97,auVar99);
            auVar194._8_4_ = 0x3f318000;
            auVar194._0_8_ = 0x3f3180003f318000;
            auVar194._12_4_ = 0x3f318000;
            auVar194._16_4_ = 0x3f318000;
            auVar194._20_4_ = 0x3f318000;
            auVar194._24_4_ = 0x3f318000;
            auVar194._28_4_ = 0x3f318000;
            auVar111 = vfmsub231ps_fma(auVar67,auVar99,auVar194);
            auVar195._8_4_ = 0x395e8083;
            auVar195._0_8_ = 0x395e8083395e8083;
            auVar195._12_4_ = 0x395e8083;
            auVar195._16_4_ = 0x395e8083;
            auVar195._20_4_ = 0x395e8083;
            auVar195._24_4_ = 0x395e8083;
            auVar195._28_4_ = 0x395e8083;
            auVar168 = vfmsub231ps_fma(ZEXT1632(auVar111),auVar99,auVar195);
            auVar67 = ZEXT1632(auVar168);
            auVar27._28_4_ = 0x395e8083;
            auVar27._0_28_ =
                 ZEXT1628(CONCAT412(auVar168._12_4_ * auVar168._12_4_,
                                    CONCAT48(auVar168._8_4_ * auVar168._8_4_,
                                             CONCAT44(auVar168._4_4_ * auVar168._4_4_,
                                                      auVar168._0_4_ * auVar168._0_4_))));
            auVar243._8_4_ = 0x39506967;
            auVar243._0_8_ = 0x3950696739506967;
            auVar243._12_4_ = 0x39506967;
            auVar243._16_4_ = 0x39506967;
            auVar243._20_4_ = 0x39506967;
            auVar243._24_4_ = 0x39506967;
            auVar243._28_4_ = 0x39506967;
            auVar266._8_4_ = 0x3ab743ce;
            auVar266._0_8_ = 0x3ab743ce3ab743ce;
            auVar266._12_4_ = 0x3ab743ce;
            auVar266._16_4_ = 0x3ab743ce;
            auVar266._20_4_ = 0x3ab743ce;
            auVar266._24_4_ = 0x3ab743ce;
            auVar266._28_4_ = 0x3ab743ce;
            auVar111 = vfmadd213ps_fma(auVar243,auVar67,auVar266);
            auVar225._8_4_ = 0x3c088908;
            auVar225._0_8_ = 0x3c0889083c088908;
            auVar225._12_4_ = 0x3c088908;
            auVar225._16_4_ = 0x3c088908;
            auVar225._20_4_ = 0x3c088908;
            auVar225._24_4_ = 0x3c088908;
            auVar225._28_4_ = 0x3c088908;
            auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar67,auVar225);
            auVar226._8_4_ = 0x3d2aa9c1;
            auVar226._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar226._12_4_ = 0x3d2aa9c1;
            auVar226._16_4_ = 0x3d2aa9c1;
            auVar226._20_4_ = 0x3d2aa9c1;
            auVar226._24_4_ = 0x3d2aa9c1;
            auVar226._28_4_ = 0x3d2aa9c1;
            auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar67,auVar226);
            auVar65._8_4_ = 0x3e2aaaaa;
            auVar65._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar65._12_4_ = 0x3e2aaaaa;
            auVar65._16_4_ = 0x3e2aaaaa;
            auVar65._20_4_ = 0x3e2aaaaa;
            auVar65._24_4_ = 0x3e2aaaaa;
            auVar65._28_4_ = 0x3e2aaaaa;
            auVar67 = ZEXT1632(auVar168);
            auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar67,auVar65);
            auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar67,auVar277);
            auVar172 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar27,auVar67);
            auVar73._0_4_ = (int)auVar99._0_4_;
            auVar73._4_4_ = (int)auVar99._4_4_;
            auVar73._8_4_ = (int)auVar99._8_4_;
            auVar73._12_4_ = (int)auVar99._12_4_;
            auVar94._16_4_ = (int)auVar99._16_4_;
            auVar94._0_16_ = auVar73;
            auVar94._20_4_ = (int)auVar99._20_4_;
            auVar94._24_4_ = (int)auVar99._24_4_;
            auVar94._28_4_ = (int)auVar99._28_4_;
            auVar168 = vpslld_avx(auVar73,0x17);
            auVar111 = vpslld_avx(auVar94._16_16_,0x17);
            auVar52._8_4_ = 0x3f800000;
            auVar52._0_8_ = 0x3f8000003f800000;
            auVar52._12_4_ = 0x3f800000;
            auVar111 = vpaddd_avx(auVar111,auVar52);
            auVar168 = vpaddd_avx(auVar168,auVar52);
            auVar95._16_16_ = auVar111;
            auVar95._0_16_ = auVar168;
            auVar152._0_4_ = auVar172._0_4_ + fVar109;
            auVar152._4_4_ = auVar172._4_4_ + fVar71;
            auVar152._8_4_ = auVar172._8_4_ + fVar310;
            auVar152._12_4_ = auVar172._12_4_ + fVar167;
            auVar152._16_4_ = fVar330 + 0.0;
            auVar152._20_4_ = fVar331 + 0.0;
            auVar152._24_4_ = fVar332 + 0.0;
            auVar152._28_4_ = fVar333 + 0.0;
            auVar111 = vfmadd213ps_fma(auVar95,auVar152,auVar250);
            auVar99 = vrcpps_avx(ZEXT1632(auVar111));
            auVar111 = vfmsub213ps_fma(ZEXT1632(auVar111),auVar99,auVar250);
            auVar111 = vfnmadd132ps_fma(ZEXT1632(auVar111),auVar99,auVar99);
            auVar92 = ZEXT1632(auVar111);
            break;
          case 5:
            auVar339._8_4_ = 0x42b0c0a5;
            auVar339._0_8_ = 0x42b0c0a542b0c0a5;
            auVar339._12_4_ = 0x42b0c0a5;
            auVar339._16_4_ = 0x42b0c0a5;
            auVar339._20_4_ = 0x42b0c0a5;
            auVar339._24_4_ = 0x42b0c0a5;
            auVar339._28_4_ = 0x42b0c0a5;
            auVar99 = vminps_avx(auVar339,auVar92);
            auVar347._8_4_ = 0xc2b0c0a5;
            auVar347._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar347._12_4_ = 0xc2b0c0a5;
            auVar347._16_4_ = 0xc2b0c0a5;
            auVar347._20_4_ = 0xc2b0c0a5;
            auVar347._24_4_ = 0xc2b0c0a5;
            auVar347._28_4_ = 0xc2b0c0a5;
            auVar67 = vmaxps_avx(auVar347,auVar99);
            auVar185._8_4_ = 0x3fb8aa3b;
            auVar185._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar185._12_4_ = 0x3fb8aa3b;
            auVar185._16_4_ = 0x3fb8aa3b;
            auVar185._20_4_ = 0x3fb8aa3b;
            auVar185._24_4_ = 0x3fb8aa3b;
            auVar185._28_4_ = 0x3fb8aa3b;
            auVar111 = vfmadd213ps_fma(auVar185,auVar67,auVar277);
            auVar97 = vroundps_avx(ZEXT1632(auVar111),1);
            auVar99 = vcmpps_avx(ZEXT1632(auVar111),auVar97,1);
            auVar99 = vandps_avx(auVar99,auVar250);
            auVar99 = vsubps_avx(auVar97,auVar99);
            auVar366._8_4_ = 0x3f318000;
            auVar366._0_8_ = 0x3f3180003f318000;
            auVar366._12_4_ = 0x3f318000;
            auVar366._16_4_ = 0x3f318000;
            auVar366._20_4_ = 0x3f318000;
            auVar366._24_4_ = 0x3f318000;
            auVar366._28_4_ = 0x3f318000;
            auVar111 = vfmsub231ps_fma(auVar67,auVar99,auVar366);
            auVar348._8_4_ = 0xb95e8083;
            auVar348._0_8_ = 0xb95e8083b95e8083;
            auVar348._12_4_ = 0xb95e8083;
            auVar348._16_4_ = 0xb95e8083;
            auVar348._20_4_ = 0xb95e8083;
            auVar348._24_4_ = 0xb95e8083;
            auVar348._28_4_ = 0xb95e8083;
            auVar168 = vfnmsub231ps_fma(ZEXT1632(auVar111),auVar99,auVar348);
            auVar67 = ZEXT1632(auVar168);
            auVar25._28_4_ = auVar97._28_4_;
            auVar25._0_28_ =
                 ZEXT1628(CONCAT412(auVar168._12_4_ * auVar168._12_4_,
                                    CONCAT48(auVar168._8_4_ * auVar168._8_4_,
                                             CONCAT44(auVar168._4_4_ * auVar168._4_4_,
                                                      auVar168._0_4_ * auVar168._0_4_))));
            auVar263._8_4_ = 0x39506967;
            auVar263._0_8_ = 0x3950696739506967;
            auVar263._12_4_ = 0x39506967;
            auVar263._16_4_ = 0x39506967;
            auVar263._20_4_ = 0x39506967;
            auVar263._24_4_ = 0x39506967;
            auVar263._28_4_ = 0x39506967;
            auVar374._8_4_ = 0x3ab743ce;
            auVar374._0_8_ = 0x3ab743ce3ab743ce;
            auVar374._12_4_ = 0x3ab743ce;
            auVar374._16_4_ = 0x3ab743ce;
            auVar374._20_4_ = 0x3ab743ce;
            auVar374._24_4_ = 0x3ab743ce;
            auVar374._28_4_ = 0x3ab743ce;
            auVar111 = vfmadd213ps_fma(auVar263,auVar67,auVar374);
            auVar356._8_4_ = 0x3c088908;
            auVar356._0_8_ = 0x3c0889083c088908;
            auVar356._12_4_ = 0x3c088908;
            auVar356._16_4_ = 0x3c088908;
            auVar356._20_4_ = 0x3c088908;
            auVar356._24_4_ = 0x3c088908;
            auVar356._28_4_ = 0x3c088908;
            auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar67,auVar356);
            auVar251._8_4_ = 0x3d2aa9c1;
            auVar251._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar251._12_4_ = 0x3d2aa9c1;
            auVar251._16_4_ = 0x3d2aa9c1;
            auVar251._20_4_ = 0x3d2aa9c1;
            auVar251._24_4_ = 0x3d2aa9c1;
            auVar251._28_4_ = 0x3d2aa9c1;
            auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar67,auVar251);
            auVar375._8_4_ = 0x3e2aaaaa;
            auVar375._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar375._12_4_ = 0x3e2aaaaa;
            auVar375._16_4_ = 0x3e2aaaaa;
            auVar375._20_4_ = 0x3e2aaaaa;
            auVar375._24_4_ = 0x3e2aaaaa;
            auVar375._28_4_ = 0x3e2aaaaa;
            auVar67 = ZEXT1632(auVar168);
            auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar67,auVar375);
            auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar67,auVar277);
            auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar25,auVar67);
            auVar240._0_4_ = auVar111._0_4_ + fVar109;
            auVar240._4_4_ = auVar111._4_4_ + fVar71;
            auVar240._8_4_ = auVar111._8_4_ + fVar310;
            auVar240._12_4_ = auVar111._12_4_ + fVar167;
            auVar240._16_4_ = fVar330 + 0.0;
            auVar240._20_4_ = fVar331 + 0.0;
            auVar240._24_4_ = fVar332 + 0.0;
            auVar240._28_4_ = fVar333 + 0.0;
            auVar110._0_4_ = (int)auVar99._0_4_;
            auVar110._4_4_ = (int)auVar99._4_4_;
            auVar110._8_4_ = (int)auVar99._8_4_;
            auVar110._12_4_ = (int)auVar99._12_4_;
            auVar144._16_4_ = (int)auVar99._16_4_;
            auVar144._0_16_ = auVar110;
            auVar144._20_4_ = (int)auVar99._20_4_;
            auVar144._24_4_ = (int)auVar99._24_4_;
            auVar144._28_4_ = (int)auVar99._28_4_;
            auVar168 = vpslld_avx(auVar110,0x17);
            auVar111 = vpslld_avx(auVar144._16_16_,0x17);
            auVar202._8_4_ = 0x3f800000;
            auVar202._0_8_ = 0x3f8000003f800000;
            auVar202._12_4_ = 0x3f800000;
            auVar111 = vpaddd_avx(auVar111,auVar202);
            auVar168 = vpaddd_avx(auVar168,auVar202);
            auVar145._16_16_ = auVar111;
            auVar145._0_16_ = auVar168;
            auVar172 = vfmadd213ps_fma(auVar145,auVar240,auVar250);
            auVar186._8_4_ = 0x800000;
            auVar186._0_8_ = 0x80000000800000;
            auVar186._12_4_ = 0x800000;
            auVar186._16_4_ = 0x800000;
            auVar186._20_4_ = 0x800000;
            auVar186._24_4_ = 0x800000;
            auVar186._28_4_ = 0x800000;
            auVar99 = vmaxps_avx(ZEXT1632(auVar172),auVar186);
            auVar168 = vpsrld_avx(auVar99._0_16_,0x17);
            auVar111 = vpsrld_avx(auVar99._16_16_,0x17);
            auVar292._8_4_ = 0x807fffff;
            auVar292._0_8_ = 0x807fffff807fffff;
            auVar292._12_4_ = 0x807fffff;
            auVar292._16_4_ = 0x807fffff;
            auVar292._20_4_ = 0x807fffff;
            auVar292._24_4_ = 0x807fffff;
            auVar292._28_4_ = 0x807fffff;
            auVar99 = vandps_avx(auVar292,auVar99);
            auVar97 = vorps_avx(auVar277,auVar99);
            auVar293._8_4_ = 0x3f3504f3;
            auVar293._0_8_ = 0x3f3504f33f3504f3;
            auVar293._12_4_ = 0x3f3504f3;
            auVar293._16_4_ = 0x3f3504f3;
            auVar293._20_4_ = 0x3f3504f3;
            auVar293._24_4_ = 0x3f3504f3;
            auVar293._28_4_ = 0x3f3504f3;
            auVar67 = vcmpps_avx(auVar293,auVar97,2);
            auVar99 = vandnps_avx(auVar67,auVar97);
            auVar340._8_4_ = 0xbf800000;
            auVar340._0_8_ = 0xbf800000bf800000;
            auVar340._12_4_ = 0xbf800000;
            auVar340._16_4_ = 0xbf800000;
            auVar340._20_4_ = 0xbf800000;
            auVar340._24_4_ = 0xbf800000;
            auVar340._28_4_ = 0xbf800000;
            auVar187._0_4_ = auVar99._0_4_ + auVar97._0_4_ + -1.0;
            auVar187._4_4_ = auVar99._4_4_ + auVar97._4_4_ + -1.0;
            auVar187._8_4_ = auVar99._8_4_ + auVar97._8_4_ + -1.0;
            auVar187._12_4_ = auVar99._12_4_ + auVar97._12_4_ + -1.0;
            auVar187._16_4_ = auVar99._16_4_ + auVar97._16_4_ + -1.0;
            auVar187._20_4_ = auVar99._20_4_ + auVar97._20_4_ + -1.0;
            auVar187._24_4_ = auVar99._24_4_ + auVar97._24_4_ + -1.0;
            auVar187._28_4_ = auVar99._28_4_ + auVar97._28_4_ + -1.0;
            auVar111 = vpsubd_avx(auVar111,auVar67._16_16_);
            auVar311._8_4_ = 0xffffff81;
            auVar311._0_8_ = 0xffffff81ffffff81;
            auVar311._12_4_ = 0xffffff81;
            auVar111 = vpaddd_avx(auVar311,auVar111);
            auVar168 = vpsubd_avx(auVar168,auVar67._0_16_);
            auVar168 = vpaddd_avx(auVar311,auVar168);
            auVar241._16_16_ = auVar111;
            auVar241._0_16_ = auVar168;
            auVar264._0_4_ = auVar187._0_4_ * auVar187._0_4_;
            auVar264._4_4_ = auVar187._4_4_ * auVar187._4_4_;
            auVar264._8_4_ = auVar187._8_4_ * auVar187._8_4_;
            auVar264._12_4_ = auVar187._12_4_ * auVar187._12_4_;
            auVar264._16_4_ = auVar187._16_4_ * auVar187._16_4_;
            auVar264._20_4_ = auVar187._20_4_ * auVar187._20_4_;
            auVar264._24_4_ = auVar187._24_4_ * auVar187._24_4_;
            auVar264._28_4_ = 0;
            auVar294._8_4_ = 0x3d9021bb;
            auVar294._0_8_ = 0x3d9021bb3d9021bb;
            auVar294._12_4_ = 0x3d9021bb;
            auVar294._16_4_ = 0x3d9021bb;
            auVar294._20_4_ = 0x3d9021bb;
            auVar294._24_4_ = 0x3d9021bb;
            auVar294._28_4_ = 0x3d9021bb;
            auVar319._8_4_ = 0xbdebd1b8;
            auVar319._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar319._12_4_ = 0xbdebd1b8;
            auVar319._16_4_ = 0xbdebd1b8;
            auVar319._20_4_ = 0xbdebd1b8;
            auVar319._24_4_ = 0xbdebd1b8;
            auVar319._28_4_ = 0xbdebd1b8;
            auVar111 = vfmadd213ps_fma(auVar294,auVar187,auVar319);
            auVar320._8_4_ = 0x3def251a;
            auVar320._0_8_ = 0x3def251a3def251a;
            auVar320._12_4_ = 0x3def251a;
            auVar320._16_4_ = 0x3def251a;
            auVar320._20_4_ = 0x3def251a;
            auVar320._24_4_ = 0x3def251a;
            auVar320._28_4_ = 0x3def251a;
            auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar187,auVar320);
            auVar321._8_4_ = 0xbdfe5d4f;
            auVar321._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar321._12_4_ = 0xbdfe5d4f;
            auVar321._16_4_ = 0xbdfe5d4f;
            auVar321._20_4_ = 0xbdfe5d4f;
            auVar321._24_4_ = 0xbdfe5d4f;
            auVar321._28_4_ = 0xbdfe5d4f;
            auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar187,auVar321);
            auVar322._8_4_ = 0x3e11e9bf;
            auVar322._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar322._12_4_ = 0x3e11e9bf;
            auVar322._16_4_ = 0x3e11e9bf;
            auVar322._20_4_ = 0x3e11e9bf;
            auVar322._24_4_ = 0x3e11e9bf;
            auVar322._28_4_ = 0x3e11e9bf;
            auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar187,auVar322);
            auVar323._8_4_ = 0xbe2aae50;
            auVar323._0_8_ = 0xbe2aae50be2aae50;
            auVar323._12_4_ = 0xbe2aae50;
            auVar323._16_4_ = 0xbe2aae50;
            auVar323._20_4_ = 0xbe2aae50;
            auVar323._24_4_ = 0xbe2aae50;
            auVar323._28_4_ = 0xbe2aae50;
            auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar187,auVar323);
            auVar324._8_4_ = 0x3e4cceac;
            auVar324._0_8_ = 0x3e4cceac3e4cceac;
            auVar324._12_4_ = 0x3e4cceac;
            auVar324._16_4_ = 0x3e4cceac;
            auVar324._20_4_ = 0x3e4cceac;
            auVar324._24_4_ = 0x3e4cceac;
            auVar324._28_4_ = 0x3e4cceac;
            auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar187,auVar324);
            auVar325._8_4_ = 0xbe7ffffc;
            auVar325._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar325._12_4_ = 0xbe7ffffc;
            auVar325._16_4_ = 0xbe7ffffc;
            auVar325._20_4_ = 0xbe7ffffc;
            auVar325._24_4_ = 0xbe7ffffc;
            auVar325._28_4_ = 0xbe7ffffc;
            auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar187,auVar325);
            auVar326._8_4_ = 0x3eaaaaaa;
            auVar326._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar326._12_4_ = 0x3eaaaaaa;
            auVar326._16_4_ = 0x3eaaaaaa;
            auVar326._20_4_ = 0x3eaaaaaa;
            auVar326._24_4_ = 0x3eaaaaaa;
            auVar326._28_4_ = 0x3eaaaaaa;
            auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar187,auVar326);
            auVar295._0_4_ = auVar264._0_4_ * auVar187._0_4_ * auVar111._0_4_;
            auVar295._4_4_ = auVar264._4_4_ * auVar187._4_4_ * auVar111._4_4_;
            auVar295._8_4_ = auVar264._8_4_ * auVar187._8_4_ * auVar111._8_4_;
            auVar295._12_4_ = auVar264._12_4_ * auVar187._12_4_ * auVar111._12_4_;
            auVar295._16_4_ = auVar264._16_4_ * auVar187._16_4_ * 0.0;
            auVar295._20_4_ = auVar264._20_4_ * auVar187._20_4_ * 0.0;
            auVar295._24_4_ = auVar264._24_4_ * auVar187._24_4_ * 0.0;
            auVar295._28_4_ = 0;
            auVar67 = vcvtdq2ps_avx(auVar241);
            auVar111 = vfmadd231ps_fma(auVar295,auVar67,auVar348);
            auVar111 = vfmsub231ps_fma(ZEXT1632(auVar111),auVar277,auVar264);
            auVar99 = vcmpps_avx(ZEXT1632(auVar172),_DAT_00597120,2);
            auVar97 = vsubps_avx(ZEXT1632(auVar111),auVar187);
            auVar111 = vfmsub231ps_fma(auVar97,auVar366,auVar67);
            auVar296._8_4_ = 0xc0000000;
            auVar296._0_8_ = 0xc0000000c0000000;
            auVar296._12_4_ = 0xc0000000;
            auVar296._16_4_ = 0xc0000000;
            auVar296._20_4_ = 0xc0000000;
            auVar296._24_4_ = 0xc0000000;
            auVar296._28_4_ = 0xc0000000;
            auVar188._0_4_ = auVar111._0_4_ * -2.0;
            auVar188._4_4_ = auVar111._4_4_ * -2.0;
            auVar188._8_4_ = auVar111._8_4_ * -2.0;
            auVar188._12_4_ = auVar111._12_4_ * -2.0;
            auVar188._16_4_ = 0x80000000;
            auVar188._20_4_ = 0x80000000;
            auVar188._24_4_ = 0x80000000;
            auVar188._28_4_ = 0;
            auVar242._8_4_ = 0x7fffffff;
            auVar242._0_8_ = 0x7fffffff7fffffff;
            auVar242._12_4_ = 0x7fffffff;
            auVar242._16_4_ = 0x7fffffff;
            auVar242._20_4_ = 0x7fffffff;
            auVar242._24_4_ = 0x7fffffff;
            auVar242._28_4_ = 0x7fffffff;
            auVar99 = vblendvps_avx(auVar188,auVar242,auVar99);
            auVar189._8_4_ = 0x42b0c0a5;
            auVar189._0_8_ = 0x42b0c0a542b0c0a5;
            auVar189._12_4_ = 0x42b0c0a5;
            auVar189._16_4_ = 0x42b0c0a5;
            auVar189._20_4_ = 0x42b0c0a5;
            auVar189._24_4_ = 0x42b0c0a5;
            auVar189._28_4_ = 0x42b0c0a5;
            auVar99 = vminps_avx(auVar99,auVar189);
            auVar190._8_4_ = 0xc2b0c0a5;
            auVar190._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar190._12_4_ = 0xc2b0c0a5;
            auVar190._16_4_ = 0xc2b0c0a5;
            auVar190._20_4_ = 0xc2b0c0a5;
            auVar190._24_4_ = 0xc2b0c0a5;
            auVar190._28_4_ = 0xc2b0c0a5;
            auVar67 = vmaxps_avx(auVar99,auVar190);
            auVar191._8_4_ = 0x3fb8aa3b;
            auVar191._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar191._12_4_ = 0x3fb8aa3b;
            auVar191._16_4_ = 0x3fb8aa3b;
            auVar191._20_4_ = 0x3fb8aa3b;
            auVar191._24_4_ = 0x3fb8aa3b;
            auVar191._28_4_ = 0x3fb8aa3b;
            auVar111 = vfmadd213ps_fma(auVar191,auVar67,auVar277);
            auVar97 = vroundps_avx(ZEXT1632(auVar111),1);
            auVar99 = vcmpps_avx(ZEXT1632(auVar111),auVar97,1);
            auVar99 = vandps_avx(auVar99,auVar250);
            auVar99 = vsubps_avx(auVar97,auVar99);
            auVar111 = vfmsub231ps_fma(auVar67,auVar99,auVar366);
            auVar168 = vfnmsub231ps_fma(ZEXT1632(auVar111),auVar99,auVar348);
            auVar67 = ZEXT1632(auVar168);
            auVar26._28_4_ = auVar97._28_4_;
            auVar26._0_28_ =
                 ZEXT1628(CONCAT412(auVar168._12_4_ * auVar168._12_4_,
                                    CONCAT48(auVar168._8_4_ * auVar168._8_4_,
                                             CONCAT44(auVar168._4_4_ * auVar168._4_4_,
                                                      auVar168._0_4_ * auVar168._0_4_))));
            auVar265._8_4_ = 0x39506967;
            auVar265._0_8_ = 0x3950696739506967;
            auVar265._12_4_ = 0x39506967;
            auVar265._16_4_ = 0x39506967;
            auVar265._20_4_ = 0x39506967;
            auVar265._24_4_ = 0x39506967;
            auVar265._28_4_ = 0x39506967;
            auVar327._8_4_ = 0x3ab743ce;
            auVar327._0_8_ = 0x3ab743ce3ab743ce;
            auVar327._12_4_ = 0x3ab743ce;
            auVar327._16_4_ = 0x3ab743ce;
            auVar327._20_4_ = 0x3ab743ce;
            auVar327._24_4_ = 0x3ab743ce;
            auVar327._28_4_ = 0x3ab743ce;
            auVar111 = vfmadd213ps_fma(auVar265,auVar67,auVar327);
            auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar67,auVar356);
            auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar67,auVar251);
            auVar256 = ZEXT3264(auVar250);
            auVar67 = ZEXT1632(auVar168);
            auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar67,auVar375);
            auVar111 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar67,auVar277);
            auVar172 = vfmadd213ps_fma(ZEXT1632(auVar111),auVar26,auVar67);
            auVar112._0_4_ = (int)auVar99._0_4_;
            auVar112._4_4_ = (int)auVar99._4_4_;
            auVar112._8_4_ = (int)auVar99._8_4_;
            auVar112._12_4_ = (int)auVar99._12_4_;
            auVar146._16_4_ = (int)auVar99._16_4_;
            auVar146._0_16_ = auVar112;
            auVar146._20_4_ = (int)auVar99._20_4_;
            auVar146._24_4_ = (int)auVar99._24_4_;
            auVar146._28_4_ = (int)auVar99._28_4_;
            auVar168 = vpslld_avx(auVar112,0x17);
            auVar111 = vpslld_avx(auVar146._16_16_,0x17);
            auVar111 = vpaddd_avx(auVar111,auVar202);
            auVar168 = vpaddd_avx(auVar168,auVar202);
            auVar147._16_16_ = auVar111;
            auVar147._0_16_ = auVar168;
            auVar192._0_4_ = auVar172._0_4_ + fVar109;
            auVar192._4_4_ = auVar172._4_4_ + fVar71;
            auVar192._8_4_ = auVar172._8_4_ + fVar310;
            auVar192._12_4_ = auVar172._12_4_ + fVar167;
            auVar192._16_4_ = fVar330 + 0.0;
            auVar192._20_4_ = fVar331 + 0.0;
            auVar192._24_4_ = fVar332 + 0.0;
            auVar192._28_4_ = fVar333 + 0.0;
            auVar111 = vfmadd213ps_fma(auVar147,auVar192,auVar250);
            auVar99 = vrcpps_avx(ZEXT1632(auVar111));
            auVar111 = vfmsub213ps_fma(ZEXT1632(auVar111),auVar99,auVar250);
            auVar111 = vfnmadd132ps_fma(ZEXT1632(auVar111),auVar99,auVar99);
            auVar111 = vfnmadd213ps_fma(ZEXT1632(auVar111),auVar296,auVar340);
            auVar91 = ZEXT1628(auVar111);
            goto LAB_002e3d69;
          case 6:
            uVar8 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var19);
            auVar153._4_4_ = uVar8;
            auVar153._0_4_ = uVar8;
            auVar153._8_4_ = uVar8;
            auVar153._12_4_ = uVar8;
            auVar153._16_4_ = uVar8;
            auVar153._20_4_ = uVar8;
            auVar153._24_4_ = uVar8;
            auVar153._28_4_ = uVar8;
            uVar8 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var19))[1];
            auVar196._4_4_ = uVar8;
            auVar196._0_4_ = uVar8;
            auVar196._8_4_ = uVar8;
            auVar196._12_4_ = uVar8;
            auVar196._16_4_ = uVar8;
            auVar196._20_4_ = uVar8;
            auVar196._24_4_ = uVar8;
            auVar196._28_4_ = uVar8;
            auVar111 = vfmadd231ps_fma(auVar196,auVar92,auVar153);
            auVar99 = vmaxps_avx(ZEXT1632(auVar111),_DAT_00597120);
            auVar250 = vminps_avx(auVar99,auVar250);
            auVar91 = auVar250._0_28_;
LAB_002e3d69:
            auVar92._4_4_ = auVar91._4_4_ * fVar108;
            auVar92._0_4_ = auVar91._0_4_ * fVar72;
            auVar92._8_4_ = auVar91._8_4_ * auVar92._8_4_;
            auVar92._12_4_ = auVar91._12_4_ * auVar92._12_4_;
            auVar92._16_4_ = auVar91._16_4_ * auVar92._16_4_;
            auVar92._20_4_ = auVar91._20_4_ * auVar92._20_4_;
            auVar92._24_4_ = auVar91._24_4_ * auVar92._24_4_;
          }
          *(undefined1 (*) [32])((long)top_blob->data + uVar34 * 0x20) = auVar92;
          uVar34 = uVar34 + 1;
        } while (uVar34 != uVar36);
      }
    }
    piVar20 = (int *)CONCAT44(uStack_12c,uStack_130);
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        if (local_118 == (Allocator *)0x0) {
          if (local_138 != (undefined1 (*) [32])0x0) {
            free(local_138);
          }
        }
        else {
          (*local_118->_vptr_Allocator[3])();
        }
      }
    }
  }
  return local_164;
}

Assistant:

int InnerProduct_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}